

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O2

idx_t duckdb::TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                (Vector *left,Vector *right,optional_ptr<const_duckdb::SelectionVector,_true> sel,
                idx_t count,optional_ptr<duckdb::SelectionVector,_true> true_sel,
                optional_ptr<duckdb::SelectionVector,_true> false_sel,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  PhysicalType PVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  sel_t *psVar4;
  data_t *pdVar5;
  int *piVar6;
  short *psVar7;
  long *plVar8;
  data_ptr_t pdVar9;
  data_ptr_t pdVar10;
  UnifiedVectorFormat *pUVar11;
  idx_t i_6;
  SelectionVector *pSVar12;
  ValidityMask *pVVar13;
  ulong uVar14;
  TemplatedValidityMask<unsigned_long> *this;
  Vector *pVVar15;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  idx_t iVar16;
  reference pvVar17;
  type pVVar18;
  idx_t iVar19;
  InternalException *this_02;
  NotImplementedException *this_03;
  ulong uVar20;
  optional_ptr<duckdb::SelectionVector,_true> oVar21;
  idx_t i;
  ulong uVar22;
  interval_t *piVar23;
  double *pdVar24;
  float *pfVar25;
  string_t *psVar26;
  uhugeint_t *puVar27;
  idx_t i_45;
  sel_t sVar28;
  size_type __n;
  idx_t iVar29;
  ulong uVar30;
  optional_ptr<const_duckdb::SelectionVector,_true> oVar31;
  long lVar32;
  idx_t false_count_3;
  ulong uVar33;
  idx_t i_39;
  ValidityMask *pVVar34;
  idx_t i_48;
  optional_ptr<duckdb::ValidityMask,_true> null_mask_00;
  idx_t iVar35;
  ulong uVar36;
  long *plVar37;
  idx_t false_count;
  idx_t iVar38;
  idx_t pos;
  long lVar39;
  interval_t *piVar40;
  double *pdVar41;
  float *pfVar42;
  string_t *psVar43;
  uhugeint_t *puVar44;
  bool bVar45;
  bool bVar46;
  idx_t local_4d0;
  idx_t pos_1;
  UnifiedVectorFormat lvdata;
  idx_t local_428;
  UnifiedVectorFormat rvdata;
  optional_ptr<duckdb::ValidityMask,_true> local_3b8;
  SelectionVector lcursor;
  SelectionVector maybe_vec;
  SelectionVector rcursor;
  SelectionVector slice_sel;
  optional_ptr<duckdb::ValidityMask,_true> local_350;
  ValidityMask child_validity;
  SelectionVector true_sel_1;
  SelectionVector false_sel_1;
  Vector lchild;
  OptionalSelection false_opt;
  OptionalSelection true_opt;
  optional_ptr<duckdb::SelectionVector,_true> local_248;
  optional_ptr<const_duckdb::SelectionVector,_true> local_240;
  UnifiedVectorFormat lvdata_1;
  UnifiedVectorFormat rvdata_1;
  optional_ptr<duckdb::SelectionVector,_true> local_1a0;
  SelectionVector false_vec;
  SelectionVector true_vec;
  Vector rchild;
  Vector l_not_null;
  Vector r_not_null;
  
  PVar1 = (left->type).physical_type_;
  switch(PVar1) {
  case BOOL:
  case INT8:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar10 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar34 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = pdVar9[iVar19] != pdVar10[iVar19];
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
          return local_4d0;
        }
        iVar19 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = pdVar9[iVar19] != pdVar10[iVar19];
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
          return local_4d0;
        }
        lVar32 = 0;
        for (; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
          bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
          if (bVar45 && bVar46) {
            bVar45 = pdVar9[iVar19] != pdVar10[iVar19];
          }
          else {
            bVar45 = bVar45 != bVar46;
          }
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
        }
LAB_0177cb26:
        return count - lVar32;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar9 = left->data;
        pdVar10 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        iVar19 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar46 = false;
              }
              else {
                bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar46 | !bVar45) == 1) {
                bVar46 = (bool)(bVar46 ^ !bVar45);
              }
              else {
                bVar46 = pdVar9[iVar19] != *pdVar10;
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = pdVar9[iVar19] != *pdVar10;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = pdVar9[iVar19] != *pdVar10;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar5 = left->data;
        pdVar9 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar19 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if ((bVar45 | !bVar46) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar46);
              }
              else {
                bVar45 = *pdVar5 != pdVar9[iVar19];
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *pdVar5 != pdVar9[iVar19];
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *pdVar5 != pdVar9[iVar19];
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar46 = false;
        }
        else {
          bVar46 = (*puVar3 & 1) == 0;
        }
        if ((bVar45 | bVar46) == 1) {
          if (bVar45 != bVar46) {
LAB_017796d3:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                (true_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
              }
              return count;
            }
            return count;
          }
        }
        else if (*left->data != *right->data) goto LAB_017796d3;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          (false_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        iVar19 = 0;
        for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
          iVar35 = iVar29;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
          }
          iVar16 = iVar29;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
          }
          iVar38 = iVar29;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_01773310;
LAB_0177332d:
            iVar38 = iVar19 + 1;
            iVar16 = iVar19;
            oVar21.ptr = false_sel.ptr;
          }
          else {
            if (lvdata.data[iVar16] == rvdata.data[iVar38]) goto LAB_0177332d;
LAB_01773310:
            iVar16 = local_4d0;
            iVar38 = iVar19;
            oVar21.ptr = true_sel.ptr;
            local_4d0 = local_4d0 + 1;
          }
          (oVar21.ptr)->sel_vector[iVar16] = (sel_t)iVar35;
          iVar19 = iVar38;
        }
        goto LAB_0177bb35;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          iVar35 = iVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
          }
          iVar16 = iVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_01775711;
          }
          else if (lvdata.data[iVar35] != rvdata.data[iVar16]) {
LAB_01775711:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + 1;
          }
        }
        goto LAB_0177bb35;
      }
      lVar32 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        bVar45 = true;
        bVar46 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
        }
        if ((bVar46 & bVar45) == 0) {
          if (bVar46 == bVar45) goto LAB_01779649;
        }
        else if (lvdata.data[iVar35] == rvdata.data[iVar16]) {
LAB_01779649:
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + 1;
        }
      }
LAB_0177bb28:
      local_4d0 = count - lVar32;
      goto LAB_0177bb35;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      iVar19 = 0;
      for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
        iVar35 = iVar29;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
        }
        iVar16 = iVar29;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
        }
        iVar38 = iVar29;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
        }
        if (lvdata.data[iVar16] == rvdata.data[iVar38]) {
          iVar16 = iVar19 + 1;
          oVar21.ptr = false_sel.ptr;
        }
        else {
          iVar16 = iVar19;
          iVar19 = local_4d0;
          oVar21.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
        }
        (oVar21.ptr)->sel_vector[iVar19] = (sel_t)iVar35;
        iVar19 = iVar16;
      }
      goto LAB_0177bb35;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        if (lvdata.data[iVar35] != rvdata.data[iVar16]) {
          (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
          local_4d0 = local_4d0 + 1;
        }
      }
      goto LAB_0177bb35;
    }
    lVar32 = 0;
    for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
      iVar29 = iVar19;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
      }
      iVar35 = iVar19;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
      }
      iVar16 = iVar19;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
      }
      if (lvdata.data[iVar35] == rvdata.data[iVar16]) {
        (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
        lVar32 = lVar32 + 1;
      }
    }
    break;
  case UINT8:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar10 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar34 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = pdVar9[iVar19] != pdVar10[iVar19];
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
          return local_4d0;
        }
        iVar19 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = pdVar9[iVar19] != pdVar10[iVar19];
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
          return local_4d0;
        }
        lVar32 = 0;
        for (; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
          bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
          if (bVar45 && bVar46) {
            bVar45 = pdVar9[iVar19] != pdVar10[iVar19];
          }
          else {
            bVar45 = bVar45 != bVar46;
          }
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
        }
        goto LAB_0177cb26;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar9 = left->data;
        pdVar10 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        iVar19 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar46 = false;
              }
              else {
                bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar46 | !bVar45) == 1) {
                bVar46 = (bool)(bVar46 ^ !bVar45);
              }
              else {
                bVar46 = pdVar9[iVar19] != *pdVar10;
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = pdVar9[iVar19] != *pdVar10;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = pdVar9[iVar19] != *pdVar10;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar5 = left->data;
        pdVar9 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar19 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if ((bVar45 | !bVar46) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar46);
              }
              else {
                bVar45 = *pdVar5 != pdVar9[iVar19];
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *pdVar5 != pdVar9[iVar19];
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *pdVar5 != pdVar9[iVar19];
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar46 = false;
        }
        else {
          bVar46 = (*puVar3 & 1) == 0;
        }
        if ((bVar45 | bVar46) == 1) {
          if (bVar45 != bVar46) {
LAB_0177bfbf:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                (true_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
              }
              return count;
            }
            return count;
          }
        }
        else if (*left->data != *right->data) goto LAB_0177bfbf;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          (false_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        iVar19 = 0;
        for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
          iVar35 = iVar29;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
          }
          iVar16 = iVar29;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
          }
          iVar38 = iVar29;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_017755c5;
LAB_017755e2:
            iVar38 = iVar19 + 1;
            iVar16 = iVar19;
            oVar21.ptr = false_sel.ptr;
          }
          else {
            if (lvdata.data[iVar16] == rvdata.data[iVar38]) goto LAB_017755e2;
LAB_017755c5:
            iVar16 = local_4d0;
            iVar38 = iVar19;
            oVar21.ptr = true_sel.ptr;
            local_4d0 = local_4d0 + 1;
          }
          (oVar21.ptr)->sel_vector[iVar16] = (sel_t)iVar35;
          iVar19 = iVar38;
        }
        goto LAB_0177bb35;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          iVar35 = iVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
          }
          iVar16 = iVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_0177712e;
          }
          else if (lvdata.data[iVar35] != rvdata.data[iVar16]) {
LAB_0177712e:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + 1;
          }
        }
        goto LAB_0177bb35;
      }
      lVar32 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        bVar45 = true;
        bVar46 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
        }
        if ((bVar46 & bVar45) == 0) {
          if (bVar46 == bVar45) goto LAB_0177b409;
        }
        else if (lvdata.data[iVar35] == rvdata.data[iVar16]) {
LAB_0177b409:
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + 1;
        }
      }
      goto LAB_0177bb28;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      iVar19 = 0;
      for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
        iVar35 = iVar29;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
        }
        iVar16 = iVar29;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
        }
        iVar38 = iVar29;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
        }
        if (lvdata.data[iVar16] == rvdata.data[iVar38]) {
          iVar16 = iVar19 + 1;
          oVar21.ptr = false_sel.ptr;
        }
        else {
          iVar16 = iVar19;
          iVar19 = local_4d0;
          oVar21.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
        }
        (oVar21.ptr)->sel_vector[iVar19] = (sel_t)iVar35;
        iVar19 = iVar16;
      }
      goto LAB_0177bb35;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        if (lvdata.data[iVar35] != rvdata.data[iVar16]) {
          (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
          local_4d0 = local_4d0 + 1;
        }
      }
      goto LAB_0177bb35;
    }
    lVar32 = 0;
    for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
      iVar29 = iVar19;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
      }
      iVar35 = iVar19;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
      }
      iVar16 = iVar19;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
      }
      if (lvdata.data[iVar35] == rvdata.data[iVar16]) {
        (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
        lVar32 = lVar32 + 1;
      }
    }
    break;
  case UINT16:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar10 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar34 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = *(short *)(pdVar9 + iVar19 * 2) != *(short *)(pdVar10 + iVar19 * 2);
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
          return local_4d0;
        }
        iVar19 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = *(short *)(pdVar9 + iVar19 * 2) != *(short *)(pdVar10 + iVar19 * 2);
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
          return local_4d0;
        }
        lVar32 = 0;
        for (; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
          bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
          if (bVar45 && bVar46) {
            bVar45 = *(short *)(pdVar9 + iVar19 * 2) != *(short *)(pdVar10 + iVar19 * 2);
          }
          else {
            bVar45 = bVar45 != bVar46;
          }
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
        }
        goto LAB_0177cb26;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar9 = left->data;
        psVar7 = (short *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        iVar19 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar46 = false;
              }
              else {
                bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar46 | !bVar45) == 1) {
                bVar46 = (bool)(bVar46 ^ !bVar45);
              }
              else {
                bVar46 = *(short *)(pdVar9 + iVar19 * 2) != *psVar7;
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = *(short *)(pdVar9 + iVar19 * 2) != *psVar7;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = *(short *)(pdVar9 + iVar19 * 2) != *psVar7;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar7 = (short *)left->data;
        pdVar9 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar19 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if ((bVar45 | !bVar46) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar46);
              }
              else {
                bVar45 = *psVar7 != *(short *)(pdVar9 + iVar19 * 2);
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *psVar7 != *(short *)(pdVar9 + iVar19 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *psVar7 != *(short *)(pdVar9 + iVar19 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar46 = false;
        }
        else {
          bVar46 = (*puVar3 & 1) == 0;
        }
        if ((bVar45 | bVar46) == 1) {
          if (bVar45 != bVar46) {
LAB_0177be69:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                (true_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(short *)left->data != *(short *)right->data) goto LAB_0177be69;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          (false_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        iVar19 = 0;
        for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
          iVar35 = iVar29;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
          }
          iVar16 = iVar29;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
          }
          iVar38 = iVar29;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_0177542d;
LAB_0177544a:
            iVar38 = iVar19 + 1;
            iVar16 = iVar19;
            oVar21.ptr = false_sel.ptr;
          }
          else {
            if (*(short *)(lvdata.data + iVar16 * 2) == *(short *)(rvdata.data + iVar38 * 2))
            goto LAB_0177544a;
LAB_0177542d:
            iVar16 = local_4d0;
            iVar38 = iVar19;
            oVar21.ptr = true_sel.ptr;
            local_4d0 = local_4d0 + 1;
          }
          (oVar21.ptr)->sel_vector[iVar16] = (sel_t)iVar35;
          iVar19 = iVar38;
        }
        goto LAB_0177bb35;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          iVar35 = iVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
          }
          iVar16 = iVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_01776ec2;
          }
          else if (*(short *)(lvdata.data + iVar35 * 2) != *(short *)(rvdata.data + iVar16 * 2)) {
LAB_01776ec2:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + 1;
          }
        }
        goto LAB_0177bb35;
      }
      lVar32 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        bVar45 = true;
        bVar46 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
        }
        if ((bVar46 & bVar45) == 0) {
          if (bVar46 == bVar45) goto LAB_0177b20f;
        }
        else if (*(short *)(lvdata.data + iVar35 * 2) == *(short *)(rvdata.data + iVar16 * 2)) {
LAB_0177b20f:
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + 1;
        }
      }
      goto LAB_0177bb28;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      iVar19 = 0;
      for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
        iVar35 = iVar29;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
        }
        iVar16 = iVar29;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
        }
        iVar38 = iVar29;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
        }
        if (*(short *)(lvdata.data + iVar16 * 2) == *(short *)(rvdata.data + iVar38 * 2)) {
          iVar16 = iVar19 + 1;
          oVar21.ptr = false_sel.ptr;
        }
        else {
          iVar16 = iVar19;
          iVar19 = local_4d0;
          oVar21.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
        }
        (oVar21.ptr)->sel_vector[iVar19] = (sel_t)iVar35;
        iVar19 = iVar16;
      }
      goto LAB_0177bb35;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        if (*(short *)(lvdata.data + iVar35 * 2) != *(short *)(rvdata.data + iVar16 * 2)) {
          (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
          local_4d0 = local_4d0 + 1;
        }
      }
      goto LAB_0177bb35;
    }
    lVar32 = 0;
    for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
      iVar29 = iVar19;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
      }
      iVar35 = iVar19;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
      }
      iVar16 = iVar19;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
      }
      if (*(short *)(lvdata.data + iVar35 * 2) == *(short *)(rvdata.data + iVar16 * 2)) {
        (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
        lVar32 = lVar32 + 1;
      }
    }
    break;
  case INT16:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar10 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar34 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = *(short *)(pdVar9 + iVar19 * 2) != *(short *)(pdVar10 + iVar19 * 2);
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
          return local_4d0;
        }
        iVar19 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = *(short *)(pdVar9 + iVar19 * 2) != *(short *)(pdVar10 + iVar19 * 2);
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
          return local_4d0;
        }
        lVar32 = 0;
        for (; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
          bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
          if (bVar45 && bVar46) {
            bVar45 = *(short *)(pdVar9 + iVar19 * 2) != *(short *)(pdVar10 + iVar19 * 2);
          }
          else {
            bVar45 = bVar45 != bVar46;
          }
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
        }
        goto LAB_0177cb26;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar9 = left->data;
        psVar7 = (short *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        iVar19 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar46 = false;
              }
              else {
                bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar46 | !bVar45) == 1) {
                bVar46 = (bool)(bVar46 ^ !bVar45);
              }
              else {
                bVar46 = *(short *)(pdVar9 + iVar19 * 2) != *psVar7;
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = *(short *)(pdVar9 + iVar19 * 2) != *psVar7;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = *(short *)(pdVar9 + iVar19 * 2) != *psVar7;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        psVar7 = (short *)left->data;
        pdVar9 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar19 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if ((bVar45 | !bVar46) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar46);
              }
              else {
                bVar45 = *psVar7 != *(short *)(pdVar9 + iVar19 * 2);
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *psVar7 != *(short *)(pdVar9 + iVar19 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *psVar7 != *(short *)(pdVar9 + iVar19 * 2);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar46 = false;
        }
        else {
          bVar46 = (*puVar3 & 1) == 0;
        }
        if ((bVar45 | bVar46) == 1) {
          if (bVar45 != bVar46) {
LAB_0177c231:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                (true_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(short *)left->data != *(short *)right->data) goto LAB_0177c231;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          (false_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        iVar19 = 0;
        for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
          iVar35 = iVar29;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
          }
          iVar16 = iVar29;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
          }
          iVar38 = iVar29;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_017759a5;
LAB_017759c2:
            iVar38 = iVar19 + 1;
            iVar16 = iVar19;
            oVar21.ptr = false_sel.ptr;
          }
          else {
            if (*(short *)(lvdata.data + iVar16 * 2) == *(short *)(rvdata.data + iVar38 * 2))
            goto LAB_017759c2;
LAB_017759a5:
            iVar16 = local_4d0;
            iVar38 = iVar19;
            oVar21.ptr = true_sel.ptr;
            local_4d0 = local_4d0 + 1;
          }
          (oVar21.ptr)->sel_vector[iVar16] = (sel_t)iVar35;
          iVar19 = iVar38;
        }
        goto LAB_0177bb35;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          iVar35 = iVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
          }
          iVar16 = iVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_01777542;
          }
          else if (*(short *)(lvdata.data + iVar35 * 2) != *(short *)(rvdata.data + iVar16 * 2)) {
LAB_01777542:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + 1;
          }
        }
        goto LAB_0177bb35;
      }
      lVar32 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        bVar45 = true;
        bVar46 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
        }
        if ((bVar46 & bVar45) == 0) {
          if (bVar46 == bVar45) goto LAB_0177b770;
        }
        else if (*(short *)(lvdata.data + iVar35 * 2) == *(short *)(rvdata.data + iVar16 * 2)) {
LAB_0177b770:
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + 1;
        }
      }
      goto LAB_0177bb28;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      iVar19 = 0;
      for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
        iVar35 = iVar29;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
        }
        iVar16 = iVar29;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
        }
        iVar38 = iVar29;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
        }
        if (*(short *)(lvdata.data + iVar16 * 2) == *(short *)(rvdata.data + iVar38 * 2)) {
          iVar16 = iVar19 + 1;
          oVar21.ptr = false_sel.ptr;
        }
        else {
          iVar16 = iVar19;
          iVar19 = local_4d0;
          oVar21.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
        }
        (oVar21.ptr)->sel_vector[iVar19] = (sel_t)iVar35;
        iVar19 = iVar16;
      }
      goto LAB_0177bb35;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        if (*(short *)(lvdata.data + iVar35 * 2) != *(short *)(rvdata.data + iVar16 * 2)) {
          (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
          local_4d0 = local_4d0 + 1;
        }
      }
      goto LAB_0177bb35;
    }
    lVar32 = 0;
    for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
      iVar29 = iVar19;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
      }
      iVar35 = iVar19;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
      }
      iVar16 = iVar19;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
      }
      if (*(short *)(lvdata.data + iVar35 * 2) == *(short *)(rvdata.data + iVar16 * 2)) {
        (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
        lVar32 = lVar32 + 1;
      }
    }
    break;
  case UINT32:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar10 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar34 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = *(int *)(pdVar9 + iVar19 * 4) != *(int *)(pdVar10 + iVar19 * 4);
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
          return local_4d0;
        }
        iVar19 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = *(int *)(pdVar9 + iVar19 * 4) != *(int *)(pdVar10 + iVar19 * 4);
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
          return local_4d0;
        }
        lVar32 = 0;
        for (; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
          bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
          if (bVar45 && bVar46) {
            bVar45 = *(int *)(pdVar9 + iVar19 * 4) != *(int *)(pdVar10 + iVar19 * 4);
          }
          else {
            bVar45 = bVar45 != bVar46;
          }
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
        }
        goto LAB_0177cb26;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar9 = left->data;
        piVar6 = (int *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        iVar19 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar46 = false;
              }
              else {
                bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar46 | !bVar45) == 1) {
                bVar46 = (bool)(bVar46 ^ !bVar45);
              }
              else {
                bVar46 = *(int *)(pdVar9 + iVar19 * 4) != *piVar6;
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = *(int *)(pdVar9 + iVar19 * 4) != *piVar6;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = *(int *)(pdVar9 + iVar19 * 4) != *piVar6;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar6 = (int *)left->data;
        pdVar9 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar19 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if ((bVar45 | !bVar46) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar46);
              }
              else {
                bVar45 = *piVar6 != *(int *)(pdVar9 + iVar19 * 4);
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *piVar6 != *(int *)(pdVar9 + iVar19 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *piVar6 != *(int *)(pdVar9 + iVar19 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar46 = false;
        }
        else {
          bVar46 = (*puVar3 & 1) == 0;
        }
        if ((bVar45 | bVar46) == 1) {
          if (bVar45 != bVar46) {
LAB_0177bdbc:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                (true_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(int *)left->data != *(int *)right->data) goto LAB_0177bdbc;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          (false_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        iVar19 = 0;
        for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
          iVar35 = iVar29;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
          }
          iVar16 = iVar29;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
          }
          iVar38 = iVar29;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_0177535f;
LAB_0177537c:
            iVar38 = iVar19 + 1;
            iVar16 = iVar19;
            oVar21.ptr = false_sel.ptr;
          }
          else {
            if (*(int *)(lvdata.data + iVar16 * 4) == *(int *)(rvdata.data + iVar38 * 4))
            goto LAB_0177537c;
LAB_0177535f:
            iVar16 = local_4d0;
            iVar38 = iVar19;
            oVar21.ptr = true_sel.ptr;
            local_4d0 = local_4d0 + 1;
          }
          (oVar21.ptr)->sel_vector[iVar16] = (sel_t)iVar35;
          iVar19 = iVar38;
        }
        goto LAB_0177bb35;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          iVar35 = iVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
          }
          iVar16 = iVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_01776d88;
          }
          else if (*(int *)(lvdata.data + iVar35 * 4) != *(int *)(rvdata.data + iVar16 * 4)) {
LAB_01776d88:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + 1;
          }
        }
        goto LAB_0177bb35;
      }
      lVar32 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        bVar45 = true;
        bVar46 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
        }
        if ((bVar46 & bVar45) == 0) {
          if (bVar46 == bVar45) goto LAB_0177b10e;
        }
        else if (*(int *)(lvdata.data + iVar35 * 4) == *(int *)(rvdata.data + iVar16 * 4)) {
LAB_0177b10e:
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + 1;
        }
      }
      goto LAB_0177bb28;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      iVar19 = 0;
      for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
        iVar35 = iVar29;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
        }
        iVar16 = iVar29;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
        }
        iVar38 = iVar29;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
        }
        if (*(int *)(lvdata.data + iVar16 * 4) == *(int *)(rvdata.data + iVar38 * 4)) {
          iVar16 = iVar19 + 1;
          oVar21.ptr = false_sel.ptr;
        }
        else {
          iVar16 = iVar19;
          iVar19 = local_4d0;
          oVar21.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
        }
        (oVar21.ptr)->sel_vector[iVar19] = (sel_t)iVar35;
        iVar19 = iVar16;
      }
      goto LAB_0177bb35;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        if (*(int *)(lvdata.data + iVar35 * 4) != *(int *)(rvdata.data + iVar16 * 4)) {
          (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
          local_4d0 = local_4d0 + 1;
        }
      }
      goto LAB_0177bb35;
    }
    lVar32 = 0;
    for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
      iVar29 = iVar19;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
      }
      iVar35 = iVar19;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
      }
      iVar16 = iVar19;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
      }
      if (*(int *)(lvdata.data + iVar35 * 4) == *(int *)(rvdata.data + iVar16 * 4)) {
        (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
        lVar32 = lVar32 + 1;
      }
    }
    break;
  case INT32:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar10 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar34 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = *(int *)(pdVar9 + iVar19 * 4) != *(int *)(pdVar10 + iVar19 * 4);
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
          return local_4d0;
        }
        iVar19 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = *(int *)(pdVar9 + iVar19 * 4) != *(int *)(pdVar10 + iVar19 * 4);
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
          return local_4d0;
        }
        lVar32 = 0;
        for (; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
          bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
          if (bVar45 && bVar46) {
            bVar45 = *(int *)(pdVar9 + iVar19 * 4) != *(int *)(pdVar10 + iVar19 * 4);
          }
          else {
            bVar45 = bVar45 != bVar46;
          }
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
        }
        goto LAB_0177cb26;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar9 = left->data;
        piVar6 = (int *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        iVar19 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar46 = false;
              }
              else {
                bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar46 | !bVar45) == 1) {
                bVar46 = (bool)(bVar46 ^ !bVar45);
              }
              else {
                bVar46 = *(int *)(pdVar9 + iVar19 * 4) != *piVar6;
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = *(int *)(pdVar9 + iVar19 * 4) != *piVar6;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = *(int *)(pdVar9 + iVar19 * 4) != *piVar6;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar6 = (int *)left->data;
        pdVar9 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar19 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if ((bVar45 | !bVar46) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar46);
              }
              else {
                bVar45 = *piVar6 != *(int *)(pdVar9 + iVar19 * 4);
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *piVar6 != *(int *)(pdVar9 + iVar19 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *piVar6 != *(int *)(pdVar9 + iVar19 * 4);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar46 = false;
        }
        else {
          bVar46 = (*puVar3 & 1) == 0;
        }
        if ((bVar45 | bVar46) == 1) {
          if (bVar45 != bVar46) {
LAB_0177bf14:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                (true_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(int *)left->data != *(int *)right->data) goto LAB_0177bf14;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          (false_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        iVar19 = 0;
        for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
          iVar35 = iVar29;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
          }
          iVar16 = iVar29;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
          }
          iVar38 = iVar29;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_017754f9;
LAB_01775516:
            iVar38 = iVar19 + 1;
            iVar16 = iVar19;
            oVar21.ptr = false_sel.ptr;
          }
          else {
            if (*(int *)(lvdata.data + iVar16 * 4) == *(int *)(rvdata.data + iVar38 * 4))
            goto LAB_01775516;
LAB_017754f9:
            iVar16 = local_4d0;
            iVar38 = iVar19;
            oVar21.ptr = true_sel.ptr;
            local_4d0 = local_4d0 + 1;
          }
          (oVar21.ptr)->sel_vector[iVar16] = (sel_t)iVar35;
          iVar19 = iVar38;
        }
        goto LAB_0177bb35;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          iVar35 = iVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
          }
          iVar16 = iVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_01776ff8;
          }
          else if (*(int *)(lvdata.data + iVar35 * 4) != *(int *)(rvdata.data + iVar16 * 4)) {
LAB_01776ff8:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + 1;
          }
        }
        goto LAB_0177bb35;
      }
      lVar32 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        bVar45 = true;
        bVar46 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
        }
        if ((bVar46 & bVar45) == 0) {
          if (bVar46 == bVar45) goto LAB_0177b30c;
        }
        else if (*(int *)(lvdata.data + iVar35 * 4) == *(int *)(rvdata.data + iVar16 * 4)) {
LAB_0177b30c:
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + 1;
        }
      }
      goto LAB_0177bb28;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      iVar19 = 0;
      for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
        iVar35 = iVar29;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
        }
        iVar16 = iVar29;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
        }
        iVar38 = iVar29;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
        }
        if (*(int *)(lvdata.data + iVar16 * 4) == *(int *)(rvdata.data + iVar38 * 4)) {
          iVar16 = iVar19 + 1;
          oVar21.ptr = false_sel.ptr;
        }
        else {
          iVar16 = iVar19;
          iVar19 = local_4d0;
          oVar21.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
        }
        (oVar21.ptr)->sel_vector[iVar19] = (sel_t)iVar35;
        iVar19 = iVar16;
      }
      goto LAB_0177bb35;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        if (*(int *)(lvdata.data + iVar35 * 4) != *(int *)(rvdata.data + iVar16 * 4)) {
          (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
          local_4d0 = local_4d0 + 1;
        }
      }
      goto LAB_0177bb35;
    }
    lVar32 = 0;
    for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
      iVar29 = iVar19;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
      }
      iVar35 = iVar19;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
      }
      iVar16 = iVar19;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
      }
      if (*(int *)(lvdata.data + iVar35 * 4) == *(int *)(rvdata.data + iVar16 * 4)) {
        (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
        lVar32 = lVar32 + 1;
      }
    }
    break;
  case UINT64:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar10 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar34 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = *(long *)(pdVar9 + iVar19 * 8) != *(long *)(pdVar10 + iVar19 * 8);
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
          return local_4d0;
        }
        iVar19 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = *(long *)(pdVar9 + iVar19 * 8) != *(long *)(pdVar10 + iVar19 * 8);
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
          return local_4d0;
        }
        lVar32 = 0;
        for (; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
          bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
          if (bVar45 && bVar46) {
            bVar45 = *(long *)(pdVar9 + iVar19 * 8) != *(long *)(pdVar10 + iVar19 * 8);
          }
          else {
            bVar45 = bVar45 != bVar46;
          }
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
        }
        goto LAB_0177cb26;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar9 = left->data;
        plVar8 = (long *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        iVar19 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar46 = false;
              }
              else {
                bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar46 | !bVar45) == 1) {
                bVar46 = (bool)(bVar46 ^ !bVar45);
              }
              else {
                bVar46 = *(long *)(pdVar9 + iVar19 * 8) != *plVar8;
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = *(long *)(pdVar9 + iVar19 * 8) != *plVar8;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = *(long *)(pdVar9 + iVar19 * 8) != *plVar8;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        plVar8 = (long *)left->data;
        pdVar9 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar19 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if ((bVar45 | !bVar46) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar46);
              }
              else {
                bVar45 = *plVar8 != *(long *)(pdVar9 + iVar19 * 8);
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *plVar8 != *(long *)(pdVar9 + iVar19 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *plVar8 != *(long *)(pdVar9 + iVar19 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar46 = false;
        }
        else {
          bVar46 = (*puVar3 & 1) == 0;
        }
        if ((bVar45 | bVar46) == 1) {
          if (bVar45 != bVar46) {
LAB_0177bd11:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                (true_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(long *)left->data != *(long *)right->data) goto LAB_0177bd11;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          (false_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        iVar19 = 0;
        for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
          iVar35 = iVar29;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
          }
          iVar16 = iVar29;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
          }
          iVar38 = iVar29;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_01775293;
LAB_017752b0:
            iVar38 = iVar19 + 1;
            iVar16 = iVar19;
            oVar21.ptr = false_sel.ptr;
          }
          else {
            if (*(long *)(lvdata.data + iVar16 * 8) == *(long *)(rvdata.data + iVar38 * 8))
            goto LAB_017752b0;
LAB_01775293:
            iVar16 = local_4d0;
            iVar38 = iVar19;
            oVar21.ptr = true_sel.ptr;
            local_4d0 = local_4d0 + 1;
          }
          (oVar21.ptr)->sel_vector[iVar16] = (sel_t)iVar35;
          iVar19 = iVar38;
        }
        goto LAB_0177bb35;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          iVar35 = iVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
          }
          iVar16 = iVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_01776c52;
          }
          else if (*(long *)(lvdata.data + iVar35 * 8) != *(long *)(rvdata.data + iVar16 * 8)) {
LAB_01776c52:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + 1;
          }
        }
        goto LAB_0177bb35;
      }
      lVar32 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        bVar45 = true;
        bVar46 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
        }
        if ((bVar46 & bVar45) == 0) {
          if (bVar46 == bVar45) goto LAB_0177b011;
        }
        else if (*(long *)(lvdata.data + iVar35 * 8) == *(long *)(rvdata.data + iVar16 * 8)) {
LAB_0177b011:
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + 1;
        }
      }
      goto LAB_0177bb28;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      iVar19 = 0;
      for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
        iVar35 = iVar29;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
        }
        iVar16 = iVar29;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
        }
        iVar38 = iVar29;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
        }
        if (*(long *)(lvdata.data + iVar16 * 8) == *(long *)(rvdata.data + iVar38 * 8)) {
          iVar16 = iVar19 + 1;
          oVar21.ptr = false_sel.ptr;
        }
        else {
          iVar16 = iVar19;
          iVar19 = local_4d0;
          oVar21.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
        }
        (oVar21.ptr)->sel_vector[iVar19] = (sel_t)iVar35;
        iVar19 = iVar16;
      }
      goto LAB_0177bb35;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        if (*(long *)(lvdata.data + iVar35 * 8) != *(long *)(rvdata.data + iVar16 * 8)) {
          (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
          local_4d0 = local_4d0 + 1;
        }
      }
      goto LAB_0177bb35;
    }
    lVar32 = 0;
    for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
      iVar29 = iVar19;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
      }
      iVar35 = iVar19;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
      }
      iVar16 = iVar19;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
      }
      if (*(long *)(lvdata.data + iVar35 * 8) == *(long *)(rvdata.data + iVar16 * 8)) {
        (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
        lVar32 = lVar32 + 1;
      }
    }
    break;
  case INT64:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar9 = left->data;
        pdVar10 = right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar34 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = *(long *)(pdVar9 + iVar19 * 8) != *(long *)(pdVar10 + iVar19 * 8);
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
          return local_4d0;
        }
        iVar19 = 0;
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (bVar45 && bVar46) {
              bVar45 = *(long *)(pdVar9 + iVar19 * 8) != *(long *)(pdVar10 + iVar19 * 8);
            }
            else {
              bVar45 = bVar45 != bVar46;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
          return local_4d0;
        }
        lVar32 = 0;
        for (; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
          bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
          if (bVar45 && bVar46) {
            bVar45 = *(long *)(pdVar9 + iVar19 * 8) != *(long *)(pdVar10 + iVar19 * 8);
          }
          else {
            bVar45 = bVar45 != bVar46;
          }
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
        }
        goto LAB_0177cb26;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar9 = left->data;
        plVar8 = (long *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        iVar19 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar46 = false;
              }
              else {
                bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              if ((bVar46 | !bVar45) == 1) {
                bVar46 = (bool)(bVar46 ^ !bVar45);
              }
              else {
                bVar46 = *(long *)(pdVar9 + iVar19 * 8) != *plVar8;
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = *(long *)(pdVar9 + iVar19 * 8) != *plVar8;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            if ((bVar46 | !bVar45) == 1) {
              bVar46 = (bool)(bVar46 ^ !bVar45);
            }
            else {
              bVar46 = *(long *)(pdVar9 + iVar19 * 8) != *plVar8;
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar46;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        plVar8 = (long *)left->data;
        pdVar9 = right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar19 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if ((bVar45 | !bVar46) == 1) {
                bVar45 = (bool)(bVar45 ^ !bVar46);
              }
              else {
                bVar45 = *plVar8 != *(long *)(pdVar9 + iVar19 * 8);
              }
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *plVar8 != *(long *)(pdVar9 + iVar19 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if ((bVar45 | !bVar46) == 1) {
              bVar45 = (bool)(bVar45 ^ !bVar46);
            }
            else {
              bVar45 = *plVar8 != *(long *)(pdVar9 + iVar19 * 8);
            }
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
          }
        }
        goto LAB_0177d837;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar46 = false;
        }
        else {
          bVar46 = (*puVar3 & 1) == 0;
        }
        if ((bVar45 | bVar46) == 1) {
          if (bVar45 != bVar46) {
LAB_0177bc64:
            if (true_sel.ptr != (SelectionVector *)0x0) {
              for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                (true_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
              }
              return count;
            }
            return count;
          }
        }
        else if (*(long *)left->data != *(long *)right->data) goto LAB_0177bc64;
        if (false_sel.ptr == (SelectionVector *)0x0) {
          return 0;
        }
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          (false_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
        }
        return 0;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        iVar19 = 0;
        for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
          iVar35 = iVar29;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
          }
          iVar16 = iVar29;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
          }
          iVar38 = iVar29;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_017751c6;
LAB_017751e3:
            iVar38 = iVar19 + 1;
            iVar16 = iVar19;
            oVar21.ptr = false_sel.ptr;
          }
          else {
            if (*(long *)(lvdata.data + iVar16 * 8) == *(long *)(rvdata.data + iVar38 * 8))
            goto LAB_017751e3;
LAB_017751c6:
            iVar16 = local_4d0;
            iVar38 = iVar19;
            oVar21.ptr = true_sel.ptr;
            local_4d0 = local_4d0 + 1;
          }
          (oVar21.ptr)->sel_vector[iVar16] = (sel_t)iVar35;
          iVar19 = iVar38;
        }
        goto LAB_0177bb35;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          iVar35 = iVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
          }
          iVar16 = iVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
          }
          bVar45 = true;
          bVar46 = true;
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (unsigned_long *)0x0) {
            bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
          }
          if ((bVar46 & bVar45) == 0) {
            if (bVar46 != bVar45) goto LAB_01776b1c;
          }
          else if (*(long *)(lvdata.data + iVar35 * 8) != *(long *)(rvdata.data + iVar16 * 8)) {
LAB_01776b1c:
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + 1;
          }
        }
        goto LAB_0177bb35;
      }
      lVar32 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        bVar45 = true;
        bVar46 = true;
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
        }
        if ((bVar46 & bVar45) == 0) {
          if (bVar46 == bVar45) goto LAB_0177af13;
        }
        else if (*(long *)(lvdata.data + iVar35 * 8) == *(long *)(rvdata.data + iVar16 * 8)) {
LAB_0177af13:
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + 1;
        }
      }
      goto LAB_0177bb28;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      iVar19 = 0;
      for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
        iVar35 = iVar29;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
        }
        iVar16 = iVar29;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
        }
        iVar38 = iVar29;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
        }
        if (*(long *)(lvdata.data + iVar16 * 8) == *(long *)(rvdata.data + iVar38 * 8)) {
          iVar16 = iVar19 + 1;
          oVar21.ptr = false_sel.ptr;
        }
        else {
          iVar16 = iVar19;
          iVar19 = local_4d0;
          oVar21.ptr = true_sel.ptr;
          local_4d0 = local_4d0 + 1;
        }
        (oVar21.ptr)->sel_vector[iVar19] = (sel_t)iVar35;
        iVar19 = iVar16;
      }
      goto LAB_0177bb35;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        if (*(long *)(lvdata.data + iVar35 * 8) != *(long *)(rvdata.data + iVar16 * 8)) {
          (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
          local_4d0 = local_4d0 + 1;
        }
      }
      goto LAB_0177bb35;
    }
    lVar32 = 0;
    for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
      iVar29 = iVar19;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
      }
      iVar35 = iVar19;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
      }
      iVar16 = iVar19;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
      }
      if (*(long *)(lvdata.data + iVar35 * 8) == *(long *)(rvdata.data + iVar16 * 8)) {
        (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
        lVar32 = lVar32 + 1;
      }
    }
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
switchD_01771e84_caseD_a:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&lvdata,"Invalid type for distinct selection",(allocator *)&rvdata);
    InternalException::InternalException(this_02,(string *)&lvdata);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar25 = (float *)left->data;
        pfVar42 = (float *)right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar34 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar45 = DistinctFrom::Operation<float>(pfVar25,pfVar42,!bVar45,!bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)!bVar45;
            pfVar42 = pfVar42 + 1;
            pfVar25 = pfVar25 + 1;
          }
          return local_4d0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar45 = DistinctFrom::Operation<float>(pfVar25,pfVar42,!bVar45,!bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            pfVar42 = pfVar42 + 1;
            pfVar25 = pfVar25 + 1;
          }
          return local_4d0;
        }
        lVar32 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
          bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
          bVar45 = DistinctFrom::Operation<float>(pfVar25,pfVar42,!bVar45,!bVar46);
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + (ulong)!bVar45;
          pfVar42 = pfVar42 + 1;
          pfVar25 = pfVar25 + 1;
        }
        goto LAB_0177cb26;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pfVar25 = (float *)left->data;
        pfVar42 = (float *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        iVar19 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar46 = false;
              }
              else {
                bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = DistinctFrom::Operation<float>(pfVar25,pfVar42,!bVar45,bVar46);
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)!bVar45;
              pfVar25 = pfVar25 + 1;
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = DistinctFrom::Operation<float>(pfVar25,pfVar42,!bVar45,bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            pfVar25 = pfVar25 + 1;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = DistinctFrom::Operation<float>(pfVar25,pfVar42,!bVar45,bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)!bVar45;
            pfVar25 = pfVar25 + 1;
          }
        }
        goto LAB_0177d837;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pfVar25 = (float *)left->data;
        pfVar42 = (float *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar19 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar45 = DistinctFrom::Operation<float>(pfVar25,pfVar42,bVar45,!bVar46);
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)!bVar45;
              pfVar42 = pfVar42 + 1;
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar45 = DistinctFrom::Operation<float>(pfVar25,pfVar42,bVar45,!bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            pfVar42 = pfVar42 + 1;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar45 = DistinctFrom::Operation<float>(pfVar25,pfVar42,bVar45,!bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)!bVar45;
            pfVar42 = pfVar42 + 1;
          }
        }
        goto LAB_0177d837;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar46 = false;
        }
        else {
          bVar46 = (*puVar3 & 1) == 0;
        }
        bVar45 = DistinctFrom::Operation<float>
                           ((float *)left->data,(float *)right->data,bVar45,bVar46);
        if (!bVar45) {
          if (false_sel.ptr == (SelectionVector *)0x0) {
            return 0;
          }
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            (false_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
          }
          return 0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            (true_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
          }
          return count;
        }
        return count;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        iVar19 = 0;
        for (uVar36 = 0; count != uVar36; uVar36 = uVar36 + 1) {
          uVar22 = uVar36;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar22 = (ulong)(sel.ptr)->sel_vector[uVar36];
          }
          uVar30 = uVar36;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar30 = (ulong)(lvdata.sel)->sel_vector[uVar36];
          }
          uVar20 = uVar36;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)(rvdata.sel)->sel_vector[uVar36];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar30 >> 6] >> (uVar30 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar46 = false;
          }
          else {
            bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar20 >> 6] >> (uVar20 & 0x3f) & 1) == 0;
          }
          bVar45 = DistinctFrom::Operation<float>
                             ((float *)(lvdata.data + uVar30 * 4),
                              (float *)(rvdata.data + uVar20 * 4),bVar45,bVar46);
          if (bVar45) {
            iVar29 = local_4d0;
            oVar21.ptr = true_sel.ptr;
            iVar35 = iVar19;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar35 = iVar19 + 1;
            iVar29 = iVar19;
            oVar21.ptr = false_sel.ptr;
          }
          (oVar21.ptr)->sel_vector[iVar29] = (sel_t)uVar22;
          iVar19 = iVar35;
        }
        goto LAB_0177bb35;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        for (uVar36 = 0; count != uVar36; uVar36 = uVar36 + 1) {
          uVar22 = uVar36;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar22 = (ulong)(sel.ptr)->sel_vector[uVar36];
          }
          uVar30 = uVar36;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar30 = (ulong)(lvdata.sel)->sel_vector[uVar36];
          }
          uVar20 = uVar36;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)(rvdata.sel)->sel_vector[uVar36];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar30 >> 6] >> (uVar30 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar46 = false;
          }
          else {
            bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar20 >> 6] >> (uVar20 & 0x3f) & 1) == 0;
          }
          bVar45 = DistinctFrom::Operation<float>
                             ((float *)(lvdata.data + uVar30 * 4),
                              (float *)(rvdata.data + uVar20 * 4),bVar45,bVar46);
          if (bVar45) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar22;
            local_4d0 = local_4d0 + 1;
          }
        }
        goto LAB_0177bb35;
      }
      lVar32 = 0;
      for (uVar36 = 0; count != uVar36; uVar36 = uVar36 + 1) {
        uVar22 = uVar36;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar22 = (ulong)(sel.ptr)->sel_vector[uVar36];
        }
        uVar30 = uVar36;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar30 = (ulong)(lvdata.sel)->sel_vector[uVar36];
        }
        uVar20 = uVar36;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar20 = (ulong)(rvdata.sel)->sel_vector[uVar36];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar30 >> 6] >> (uVar30 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar46 = false;
        }
        else {
          bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar20 >> 6] >> (uVar20 & 0x3f) & 1) == 0;
        }
        bVar45 = DistinctFrom::Operation<float>
                           ((float *)(lvdata.data + uVar30 * 4),(float *)(rvdata.data + uVar20 * 4),
                            bVar45,bVar46);
        if (!bVar45) {
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar22;
          lVar32 = lVar32 + 1;
        }
      }
LAB_0177b9ec:
      local_4d0 = count - lVar32;
      goto LAB_0177bb35;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      iVar19 = 0;
      for (uVar36 = 0; count != uVar36; uVar36 = uVar36 + 1) {
        uVar22 = uVar36;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar22 = (ulong)(sel.ptr)->sel_vector[uVar36];
        }
        uVar30 = uVar36;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar30 = (ulong)(lvdata.sel)->sel_vector[uVar36];
        }
        uVar20 = uVar36;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar20 = (ulong)(rvdata.sel)->sel_vector[uVar36];
        }
        bVar45 = NotEquals::Operation<float>
                           ((float *)(lvdata.data + uVar30 * 4),(float *)(rvdata.data + uVar20 * 4))
        ;
        if (bVar45) {
          iVar29 = local_4d0;
          oVar21.ptr = true_sel.ptr;
          iVar35 = iVar19;
          local_4d0 = local_4d0 + 1;
        }
        else {
          iVar35 = iVar19 + 1;
          iVar29 = iVar19;
          oVar21.ptr = false_sel.ptr;
        }
        (oVar21.ptr)->sel_vector[iVar29] = (sel_t)uVar22;
        iVar19 = iVar35;
      }
      goto LAB_0177bb35;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      for (uVar36 = 0; count != uVar36; uVar36 = uVar36 + 1) {
        uVar22 = uVar36;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar22 = (ulong)(sel.ptr)->sel_vector[uVar36];
        }
        uVar30 = uVar36;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar30 = (ulong)(lvdata.sel)->sel_vector[uVar36];
        }
        uVar20 = uVar36;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar20 = (ulong)(rvdata.sel)->sel_vector[uVar36];
        }
        bVar45 = NotEquals::Operation<float>
                           ((float *)(lvdata.data + uVar30 * 4),(float *)(rvdata.data + uVar20 * 4))
        ;
        if (bVar45) {
          (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar22;
          local_4d0 = local_4d0 + 1;
        }
      }
      goto LAB_0177bb35;
    }
    lVar32 = 0;
    for (uVar36 = 0; count != uVar36; uVar36 = uVar36 + 1) {
      uVar22 = uVar36;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        uVar22 = (ulong)(sel.ptr)->sel_vector[uVar36];
      }
      uVar30 = uVar36;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar30 = (ulong)(lvdata.sel)->sel_vector[uVar36];
      }
      uVar20 = uVar36;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar20 = (ulong)(rvdata.sel)->sel_vector[uVar36];
      }
      bVar45 = NotEquals::Operation<float>
                         ((float *)(lvdata.data + uVar30 * 4),(float *)(rvdata.data + uVar20 * 4));
      if (!bVar45) {
        (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar22;
        lVar32 = lVar32 + 1;
      }
    }
    goto LAB_0177b921;
  case DOUBLE:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar24 = (double *)left->data;
        pdVar41 = (double *)right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar34 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar45 = DistinctFrom::Operation<double>(pdVar24,pdVar41,!bVar45,!bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)!bVar45;
            pdVar41 = pdVar41 + 1;
            pdVar24 = pdVar24 + 1;
          }
          return local_4d0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar45 = DistinctFrom::Operation<double>(pdVar24,pdVar41,!bVar45,!bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            pdVar41 = pdVar41 + 1;
            pdVar24 = pdVar24 + 1;
          }
          return local_4d0;
        }
        lVar32 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
          bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
          bVar45 = DistinctFrom::Operation<double>(pdVar24,pdVar41,!bVar45,!bVar46);
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + (ulong)!bVar45;
          pdVar41 = pdVar41 + 1;
          pdVar24 = pdVar24 + 1;
        }
        goto LAB_0177cb26;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        pdVar24 = (double *)left->data;
        pdVar41 = (double *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        iVar19 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar46 = false;
              }
              else {
                bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = DistinctFrom::Operation<double>(pdVar24,pdVar41,!bVar45,bVar46);
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)!bVar45;
              pdVar24 = pdVar24 + 1;
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = DistinctFrom::Operation<double>(pdVar24,pdVar41,!bVar45,bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            pdVar24 = pdVar24 + 1;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = DistinctFrom::Operation<double>(pdVar24,pdVar41,!bVar45,bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)!bVar45;
            pdVar24 = pdVar24 + 1;
          }
        }
        goto LAB_0177d837;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        pdVar24 = (double *)left->data;
        pdVar41 = (double *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar19 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar45 = DistinctFrom::Operation<double>(pdVar24,pdVar41,bVar45,!bVar46);
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)!bVar45;
              pdVar41 = pdVar41 + 1;
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar45 = DistinctFrom::Operation<double>(pdVar24,pdVar41,bVar45,!bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            pdVar41 = pdVar41 + 1;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar45 = DistinctFrom::Operation<double>(pdVar24,pdVar41,bVar45,!bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)!bVar45;
            pdVar41 = pdVar41 + 1;
          }
        }
        goto LAB_0177d837;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar46 = false;
        }
        else {
          bVar46 = (*puVar3 & 1) == 0;
        }
        bVar45 = DistinctFrom::Operation<double>
                           ((double *)left->data,(double *)right->data,bVar45,bVar46);
        if (!bVar45) {
          if (false_sel.ptr == (SelectionVector *)0x0) {
            return 0;
          }
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            (false_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
          }
          return 0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            (true_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
          }
          return count;
        }
        return count;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        iVar19 = 0;
        for (uVar36 = 0; count != uVar36; uVar36 = uVar36 + 1) {
          uVar22 = uVar36;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar22 = (ulong)(sel.ptr)->sel_vector[uVar36];
          }
          uVar30 = uVar36;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar30 = (ulong)(lvdata.sel)->sel_vector[uVar36];
          }
          uVar20 = uVar36;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)(rvdata.sel)->sel_vector[uVar36];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar30 >> 6] >> (uVar30 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar46 = false;
          }
          else {
            bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar20 >> 6] >> (uVar20 & 0x3f) & 1) == 0;
          }
          bVar45 = DistinctFrom::Operation<double>
                             ((double *)(lvdata.data + uVar30 * 8),
                              (double *)(rvdata.data + uVar20 * 8),bVar45,bVar46);
          if (bVar45) {
            iVar29 = local_4d0;
            oVar21.ptr = true_sel.ptr;
            iVar35 = iVar19;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar35 = iVar19 + 1;
            iVar29 = iVar19;
            oVar21.ptr = false_sel.ptr;
          }
          (oVar21.ptr)->sel_vector[iVar29] = (sel_t)uVar22;
          iVar19 = iVar35;
        }
        goto LAB_0177bb35;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        for (uVar36 = 0; count != uVar36; uVar36 = uVar36 + 1) {
          uVar22 = uVar36;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar22 = (ulong)(sel.ptr)->sel_vector[uVar36];
          }
          uVar30 = uVar36;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar30 = (ulong)(lvdata.sel)->sel_vector[uVar36];
          }
          uVar20 = uVar36;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)(rvdata.sel)->sel_vector[uVar36];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar30 >> 6] >> (uVar30 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar46 = false;
          }
          else {
            bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar20 >> 6] >> (uVar20 & 0x3f) & 1) == 0;
          }
          bVar45 = DistinctFrom::Operation<double>
                             ((double *)(lvdata.data + uVar30 * 8),
                              (double *)(rvdata.data + uVar20 * 8),bVar45,bVar46);
          if (bVar45) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar22;
            local_4d0 = local_4d0 + 1;
          }
        }
        goto LAB_0177bb35;
      }
      lVar32 = 0;
      for (uVar36 = 0; count != uVar36; uVar36 = uVar36 + 1) {
        uVar22 = uVar36;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar22 = (ulong)(sel.ptr)->sel_vector[uVar36];
        }
        uVar30 = uVar36;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar30 = (ulong)(lvdata.sel)->sel_vector[uVar36];
        }
        uVar20 = uVar36;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar20 = (ulong)(rvdata.sel)->sel_vector[uVar36];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar30 >> 6] >> (uVar30 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar46 = false;
        }
        else {
          bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar20 >> 6] >> (uVar20 & 0x3f) & 1) == 0;
        }
        bVar45 = DistinctFrom::Operation<double>
                           ((double *)(lvdata.data + uVar30 * 8),
                            (double *)(rvdata.data + uVar20 * 8),bVar45,bVar46);
        if (!bVar45) {
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar22;
          lVar32 = lVar32 + 1;
        }
      }
      goto LAB_0177b9ec;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      iVar19 = 0;
      for (uVar36 = 0; count != uVar36; uVar36 = uVar36 + 1) {
        uVar22 = uVar36;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar22 = (ulong)(sel.ptr)->sel_vector[uVar36];
        }
        uVar30 = uVar36;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar30 = (ulong)(lvdata.sel)->sel_vector[uVar36];
        }
        uVar20 = uVar36;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar20 = (ulong)(rvdata.sel)->sel_vector[uVar36];
        }
        bVar45 = NotEquals::Operation<double>
                           ((double *)(lvdata.data + uVar30 * 8),
                            (double *)(rvdata.data + uVar20 * 8));
        if (bVar45) {
          iVar29 = local_4d0;
          oVar21.ptr = true_sel.ptr;
          iVar35 = iVar19;
          local_4d0 = local_4d0 + 1;
        }
        else {
          iVar35 = iVar19 + 1;
          iVar29 = iVar19;
          oVar21.ptr = false_sel.ptr;
        }
        (oVar21.ptr)->sel_vector[iVar29] = (sel_t)uVar22;
        iVar19 = iVar35;
      }
      goto LAB_0177bb35;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      for (uVar36 = 0; count != uVar36; uVar36 = uVar36 + 1) {
        uVar22 = uVar36;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          uVar22 = (ulong)(sel.ptr)->sel_vector[uVar36];
        }
        uVar30 = uVar36;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar30 = (ulong)(lvdata.sel)->sel_vector[uVar36];
        }
        uVar20 = uVar36;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar20 = (ulong)(rvdata.sel)->sel_vector[uVar36];
        }
        bVar45 = NotEquals::Operation<double>
                           ((double *)(lvdata.data + uVar30 * 8),
                            (double *)(rvdata.data + uVar20 * 8));
        if (bVar45) {
          (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)uVar22;
          local_4d0 = local_4d0 + 1;
        }
      }
      goto LAB_0177bb35;
    }
    lVar32 = 0;
    for (uVar36 = 0; count != uVar36; uVar36 = uVar36 + 1) {
      uVar22 = uVar36;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        uVar22 = (ulong)(sel.ptr)->sel_vector[uVar36];
      }
      uVar30 = uVar36;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar30 = (ulong)(lvdata.sel)->sel_vector[uVar36];
      }
      uVar20 = uVar36;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar20 = (ulong)(rvdata.sel)->sel_vector[uVar36];
      }
      bVar45 = NotEquals::Operation<double>
                         ((double *)(lvdata.data + uVar30 * 8),(double *)(rvdata.data + uVar20 * 8))
      ;
      if (!bVar45) {
        (false_sel.ptr)->sel_vector[lVar32] = (sel_t)uVar22;
        lVar32 = lVar32 + 1;
      }
    }
    goto LAB_0177b921;
  case INTERVAL:
    lchild._0_8_ = null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (null_mask.ptr != (ValidityMask *)0x0) {
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(left,sel.ptr,count,pVVar13);
      pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                          ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
      UpdateNullMask(right,sel.ptr,count,pVVar13);
    }
    if (left->vector_type == FLAT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar23 = (interval_t *)left->data;
        piVar40 = (interval_t *)right->data;
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        FlatVector::VerifyFlatVector(right);
        pVVar34 = &right->validity;
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar45 = DistinctFrom::Operation<duckdb::interval_t>(piVar23,piVar40,!bVar45,!bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)!bVar45;
            piVar40 = piVar40 + 1;
            piVar23 = piVar23 + 1;
          }
          return local_4d0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar45 = DistinctFrom::Operation<duckdb::interval_t>(piVar23,piVar40,!bVar45,!bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            piVar40 = piVar40 + 1;
            piVar23 = piVar23 + 1;
          }
          return local_4d0;
        }
        lVar32 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
          bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                             (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
          bVar45 = DistinctFrom::Operation<duckdb::interval_t>(piVar23,piVar40,!bVar45,!bVar46);
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + (ulong)!bVar45;
          piVar40 = piVar40 + 1;
          piVar23 = piVar23 + 1;
        }
        goto LAB_0177cb26;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        piVar23 = (interval_t *)left->data;
        piVar40 = (interval_t *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(left);
        pVVar13 = &left->validity;
        iVar19 = 0;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar46 = false;
              }
              else {
                bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = DistinctFrom::Operation<duckdb::interval_t>(piVar23,piVar40,!bVar45,bVar46);
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)!bVar45;
              piVar23 = piVar23 + 1;
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = DistinctFrom::Operation<duckdb::interval_t>(piVar23,piVar40,!bVar45,bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            piVar23 = piVar23 + 1;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar45 = DistinctFrom::Operation<duckdb::interval_t>(piVar23,piVar40,!bVar45,bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)!bVar45;
            piVar23 = piVar23 + 1;
          }
        }
        goto LAB_0177d837;
      }
    }
    else if (left->vector_type == CONSTANT_VECTOR) {
      if (right->vector_type == FLAT_VECTOR) {
        piVar23 = (interval_t *)left->data;
        piVar40 = (interval_t *)right->data;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (unsigned_long *)0x0;
        lvdata.sel = (SelectionVector *)0x0;
        lvdata.data = (data_ptr_t)0x0;
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x800;
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
        }
        FlatVector::VerifyFlatVector(right);
        pVVar13 = &right->validity;
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          iVar19 = 0;
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar32 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar45 = DistinctFrom::Operation<duckdb::interval_t>(piVar23,piVar40,bVar45,!bVar46);
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)!bVar45;
              piVar40 = piVar40 + 1;
            }
            goto LAB_0177d82a;
          }
          local_4d0 = 0;
          for (; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar45 = DistinctFrom::Operation<duckdb::interval_t>(piVar23,piVar40,bVar45,!bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            piVar40 = piVar40 + 1;
          }
        }
        else {
          lVar32 = 0;
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            if (lvdata.sel == (SelectionVector *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
            }
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar45 = DistinctFrom::Operation<duckdb::interval_t>(piVar23,piVar40,bVar45,!bVar46);
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + bVar45;
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)!bVar45;
            piVar40 = piVar40 + 1;
          }
        }
        goto LAB_0177d837;
      }
      if (right->vector_type == CONSTANT_VECTOR) {
        puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (*puVar3 & 1) == 0;
        }
        puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          bVar46 = false;
        }
        else {
          bVar46 = (*puVar3 & 1) == 0;
        }
        bVar45 = DistinctFrom::Operation<duckdb::interval_t>
                           ((interval_t *)left->data,(interval_t *)right->data,bVar45,bVar46);
        if (!bVar45) {
          if (false_sel.ptr == (SelectionVector *)0x0) {
            return 0;
          }
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            (false_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
          }
          return 0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            (true_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
          }
          return count;
        }
        return count;
      }
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(left,count,&lvdata);
    Vector::ToUnifiedFormat(right,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0 ||
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        iVar19 = 0;
        for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
          iVar35 = iVar29;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
          }
          iVar16 = iVar29;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
          }
          iVar38 = iVar29;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar46 = false;
          }
          else {
            bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) == 0;
          }
          bVar45 = DistinctFrom::Operation<duckdb::interval_t>
                             ((interval_t *)(lvdata.data + iVar16 * 0x10),
                              (interval_t *)(rvdata.data + iVar38 * 0x10),bVar45,bVar46);
          if (bVar45) {
            iVar16 = local_4d0;
            oVar21.ptr = true_sel.ptr;
            iVar38 = iVar19;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar38 = iVar19 + 1;
            iVar16 = iVar19;
            oVar21.ptr = false_sel.ptr;
          }
          (oVar21.ptr)->sel_vector[iVar16] = (sel_t)iVar35;
          iVar19 = iVar38;
        }
        goto LAB_0177bb35;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          iVar35 = iVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
          }
          iVar16 = iVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar46 = false;
          }
          else {
            bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) == 0;
          }
          bVar45 = DistinctFrom::Operation<duckdb::interval_t>
                             ((interval_t *)(lvdata.data + iVar35 * 0x10),
                              (interval_t *)(rvdata.data + iVar16 * 0x10),bVar45,bVar46);
          if (bVar45) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + 1;
          }
        }
        goto LAB_0177bb35;
      }
      lVar32 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar46 = false;
        }
        else {
          bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) == 0;
        }
        bVar45 = DistinctFrom::Operation<duckdb::interval_t>
                           ((interval_t *)(lvdata.data + iVar35 * 0x10),
                            (interval_t *)(rvdata.data + iVar16 * 0x10),bVar45,bVar46);
        if (!bVar45) {
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + 1;
        }
      }
      goto LAB_0177b9ec;
    }
    if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      iVar19 = 0;
      for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
        iVar35 = iVar29;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
        }
        iVar16 = iVar29;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
        }
        iVar38 = iVar29;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
        }
        bVar45 = NotEquals::Operation<duckdb::interval_t>
                           ((interval_t *)(lvdata.data + iVar16 * 0x10),
                            (interval_t *)(rvdata.data + iVar38 * 0x10));
        if (bVar45) {
          iVar16 = local_4d0;
          oVar21.ptr = true_sel.ptr;
          iVar38 = iVar19;
          local_4d0 = local_4d0 + 1;
        }
        else {
          iVar38 = iVar19 + 1;
          iVar16 = iVar19;
          oVar21.ptr = false_sel.ptr;
        }
        (oVar21.ptr)->sel_vector[iVar16] = (sel_t)iVar35;
        iVar19 = iVar38;
      }
      goto LAB_0177bb35;
    }
    if (true_sel.ptr != (SelectionVector *)0x0) {
      local_4d0 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        bVar45 = NotEquals::Operation<duckdb::interval_t>
                           ((interval_t *)(lvdata.data + iVar35 * 0x10),
                            (interval_t *)(rvdata.data + iVar16 * 0x10));
        if (bVar45) {
          (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
          local_4d0 = local_4d0 + 1;
        }
      }
      goto LAB_0177bb35;
    }
    lVar32 = 0;
    for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
      iVar29 = iVar19;
      if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
        iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
      }
      iVar35 = iVar19;
      if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
      }
      iVar16 = iVar19;
      if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
      }
      bVar45 = NotEquals::Operation<duckdb::interval_t>
                         ((interval_t *)(lvdata.data + iVar35 * 0x10),
                          (interval_t *)(rvdata.data + iVar16 * 0x10));
      if (!bVar45) {
        (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
        lVar32 = lVar32 + 1;
      }
    }
    goto LAB_0177b921;
  case LIST:
  case STRUCT:
  case ARRAY:
    local_248.ptr = false_sel.ptr;
    local_240.ptr = sel.ptr;
    local_1a0.ptr = true_sel.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_240.ptr = FlatVector::IncrementalSelectionVector();
    }
    SelectionVector::SelectionVector(&true_vec,count);
    OptionalSelection::OptionalSelection(&true_opt,&true_vec);
    SelectionVector::SelectionVector(&false_vec,count);
    OptionalSelection::OptionalSelection(&false_opt,&false_vec);
    SelectionVector::SelectionVector(&maybe_vec,count);
    Vector::Vector(&l_not_null,left);
    Vector::Vector(&r_not_null,right);
    pSVar12 = optional_ptr<const_duckdb::SelectionVector,_true>::operator*(&local_240);
    rchild._0_8_ = null_mask.ptr;
    UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
    UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
    Vector::ToUnifiedFormat(&l_not_null,count,&lvdata);
    Vector::ToUnifiedFormat(&r_not_null,count,&rvdata);
    if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0 &&
        lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      psVar2 = pSVar12->sel_vector;
      local_428 = 0;
      for (iVar19 = 0; uVar36 = count, count != iVar19; iVar19 = iVar19 + 1) {
        sVar28 = (sel_t)iVar19;
        if (psVar2 != (sel_t *)0x0) {
          sVar28 = psVar2[iVar19];
        }
        maybe_vec.sel_vector[iVar19] = sVar28;
      }
    }
    else {
      SelectionVector::SelectionVector((SelectionVector *)&lchild,count);
      local_428 = 0;
      iVar19 = 0;
      uVar36 = 0;
      for (uVar22 = 0; count != uVar22; uVar22 = uVar22 + 1) {
        uVar30 = uVar22;
        if (pSVar12->sel_vector != (sel_t *)0x0) {
          uVar30 = (ulong)pSVar12->sel_vector[uVar22];
        }
        uVar20 = uVar22;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar20 = (ulong)(lvdata.sel)->sel_vector[uVar22];
        }
        uVar14 = uVar22;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar14 = (ulong)(rvdata.sel)->sel_vector[uVar22];
        }
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar45 = false;
        }
        else {
          bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar20 >> 6] >> (uVar20 & 0x3f) & 1) == 0;
        }
        if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          bVar46 = false;
        }
        else {
          bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0;
        }
        sVar28 = (sel_t)uVar30;
        if ((bVar45 | bVar46) == 1) {
          if (rchild._0_8_ != 0) {
            this = &optional_ptr<duckdb::ValidityMask,_true>::operator->
                              ((optional_ptr<duckdb::ValidityMask,_true> *)&rchild)->
                    super_TemplatedValidityMask<unsigned_long>;
            TemplatedValidityMask<unsigned_long>::SetInvalid(this,uVar30);
          }
          if (bVar45 == bVar46) {
            if (false_opt.sel != (SelectionVector *)0x0) {
              (false_opt.sel)->sel_vector[iVar19] = sVar28;
            }
            iVar19 = iVar19 + 1;
          }
          else {
            if (true_opt.sel != (SelectionVector *)0x0) {
              (true_opt.sel)->sel_vector[local_428] = sVar28;
            }
            local_428 = local_428 + 1;
          }
        }
        else {
          *(int *)(lchild._0_8_ + uVar36 * 4) = (int)uVar22;
          maybe_vec.sel_vector[uVar36] = sVar28;
          uVar36 = uVar36 + 1;
        }
      }
      OptionalSelection::Advance(&true_opt,local_428);
      OptionalSelection::Advance(&false_opt,iVar19);
      if (uVar36 < count && uVar36 != 0) {
        Vector::Slice(&l_not_null,(SelectionVector *)&lchild,uVar36);
        Vector::Slice(&r_not_null,(SelectionVector *)&lchild,uVar36);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&lchild.type.type_info_);
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&rvdata);
    UnifiedVectorFormat::~UnifiedVectorFormat(&lvdata);
    PVar1 = (left->type).physical_type_;
    if (PVar1 == LIST) {
      local_3b8 = (optional_ptr<duckdb::ValidityMask,_true>)
                  (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
      if (uVar36 == 0) goto LAB_01772eb3;
      SelectionVector::SelectionVector(&lcursor,uVar36);
      SelectionVector::SelectionVector(&rcursor,uVar36);
      pVVar15 = ListVector::GetEntry(&l_not_null);
      Vector::Vector((Vector *)&lvdata,pVVar15);
      pVVar15 = ListVector::GetEntry(&r_not_null);
      Vector::Vector((Vector *)&rvdata,pVVar15);
      iVar19 = ListVector::GetListSize(&l_not_null);
      Vector::Flatten((Vector *)&lvdata,iVar19);
      iVar19 = ListVector::GetListSize(&r_not_null);
      Vector::Flatten((Vector *)&rvdata,iVar19);
      Vector::Vector(&lchild,(Vector *)&lvdata,&lcursor,uVar36);
      Vector::Vector(&rchild,(Vector *)&rvdata,&rcursor,uVar36);
      UnifiedVectorFormat::UnifiedVectorFormat(&lvdata_1);
      Vector::ToUnifiedFormat(&l_not_null,uVar36,&lvdata_1);
      pdVar9 = lvdata_1.data;
      UnifiedVectorFormat::UnifiedVectorFormat(&rvdata_1);
      Vector::ToUnifiedFormat(&r_not_null,uVar36,&rvdata_1);
      SelectionVector::SelectionVector(&slice_sel,uVar36);
      for (iVar19 = 0; uVar36 != iVar19; iVar19 = iVar19 + 1) {
        slice_sel.sel_vector[iVar19] = (sel_t)iVar19;
      }
      SelectionVector::SelectionVector(&true_sel_1,uVar36);
      SelectionVector::SelectionVector(&false_sel_1,uVar36);
      child_validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      child_validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0
      ;
      child_validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      child_validity.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
      if (local_3b8.ptr == (ValidityMask *)0x0) {
        local_350.ptr = (ValidityMask *)0x0;
      }
      else {
        pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator->(&local_3b8);
        iVar19 = ValidityMask::Capacity(pVVar13);
        local_350.ptr = &child_validity;
        TemplatedValidityMask<unsigned_long>::Reset
                  (&(local_350.ptr)->super_TemplatedValidityMask<unsigned_long>,iVar19);
      }
      pos_1 = 0;
      local_4d0 = 0;
      while (uVar36 != 0) {
        PositionListCursor(&lcursor,&lvdata_1,pos_1,&slice_sel,uVar36);
        PositionListCursor(&rcursor,&rvdata_1,pos_1,&slice_sel,uVar36);
        psVar2 = (lvdata_1.sel)->sel_vector;
        psVar4 = (rvdata_1.sel)->sel_vector;
        iVar19 = 0;
        iVar29 = 0;
        uVar30 = 0;
        for (uVar22 = 0; uVar36 != uVar22; uVar22 = uVar22 + 1) {
          uVar20 = uVar22;
          if (slice_sel.sel_vector != (sel_t *)0x0) {
            uVar20 = (ulong)slice_sel.sel_vector[uVar22];
          }
          uVar14 = uVar20;
          if (psVar2 != (sel_t *)0x0) {
            uVar14 = (ulong)psVar2[uVar20];
          }
          uVar33 = uVar20;
          if (psVar4 != (sel_t *)0x0) {
            uVar33 = (ulong)psVar4[uVar20];
          }
          if ((*(idx_t *)(pdVar9 + uVar14 * 0x10 + 8) == pos_1) ||
             (*(idx_t *)(rvdata_1.data + uVar33 * 0x10 + 8) == pos_1)) {
            if (maybe_vec.sel_vector != (sel_t *)0x0) {
              uVar20 = (ulong)maybe_vec.sel_vector[uVar20];
            }
            if (*(idx_t *)(pdVar9 + uVar14 * 0x10 + 8) ==
                *(idx_t *)(rvdata_1.data + uVar33 * 0x10 + 8)) {
              if (false_opt.sel != (SelectionVector *)0x0) {
                (false_opt.sel)->sel_vector[iVar19] = (sel_t)uVar20;
              }
              iVar19 = iVar19 + 1;
            }
            else {
              if (true_opt.sel != (SelectionVector *)0x0) {
                (true_opt.sel)->sel_vector[iVar29] = (sel_t)uVar20;
              }
              iVar29 = iVar29 + 1;
            }
          }
          else {
            true_sel_1.sel_vector[uVar30] = (sel_t)uVar20;
            uVar30 = uVar30 + 1;
          }
        }
        OptionalSelection::Advance(&true_opt,iVar29);
        OptionalSelection::Advance(&false_opt,iVar19);
        if (uVar30 < uVar36) {
          DensifyNestedSelection(&true_sel_1,uVar30,&slice_sel);
          PositionListCursor(&lcursor,&lvdata_1,pos_1,&slice_sel,uVar30);
          PositionListCursor(&rcursor,&rvdata_1,pos_1,&slice_sel,uVar30);
          uVar36 = uVar30;
        }
        iVar19 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                           (&lchild,&rchild,&slice_sel,uVar36,&true_sel_1,&false_sel_1,local_350);
        ExtractNestedMask(&slice_sel,uVar36,&maybe_vec,local_350.ptr,local_3b8);
        local_4d0 = local_4d0 + iVar29;
        if (iVar19 != 0) {
          uVar36 = uVar36 - iVar19;
          pSVar12 = &true_sel_1;
          if (uVar36 == 0) {
            pSVar12 = &slice_sel;
          }
          ExtractNestedSelection(pSVar12,iVar19,&maybe_vec,&true_opt);
          local_4d0 = local_4d0 + iVar19;
          DensifyNestedSelection(&false_sel_1,uVar36,&slice_sel);
          PositionListCursor(&lcursor,&lvdata_1,pos_1,&slice_sel,uVar36);
          PositionListCursor(&rcursor,&rvdata_1,pos_1,&slice_sel,uVar36);
        }
        ExtractNestedMask(&slice_sel,uVar36,&maybe_vec,local_350.ptr,local_3b8);
        pSVar12 = &false_sel_1;
        if (uVar36 == 0) {
          pSVar12 = &slice_sel;
        }
        ExtractNestedSelection(pSVar12,0,&maybe_vec,&false_opt);
        pos_1 = pos_1 + 1;
      }
LAB_0177653f:
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&child_validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&false_sel_1.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&true_sel_1.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&slice_sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      UnifiedVectorFormat::~UnifiedVectorFormat(&rvdata_1);
      UnifiedVectorFormat::~UnifiedVectorFormat(&lvdata_1);
      Vector::~Vector(&rchild);
      Vector::~Vector(&lchild);
      Vector::~Vector((Vector *)&rvdata);
      Vector::~Vector((Vector *)&lvdata);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rcursor.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&lcursor.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    else {
      if (PVar1 == STRUCT) {
        rcursor.sel_vector = (sel_t *)null_mask.ptr;
        if (uVar36 != 0) {
          rchild.vector_type = FLAT_VECTOR;
          rchild._1_7_ = 0;
          rchild.type.id_ = INVALID;
          rchild.type.physical_type_ = ~INVALID;
          rchild.type._2_6_ = 0;
          rchild.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          lvdata_1.sel = (SelectionVector *)0x0;
          lvdata_1.data = (data_ptr_t)0x0;
          lvdata_1.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          this_00 = StructVector::GetEntries(&l_not_null);
          this_01 = StructVector::GetEntries(&r_not_null);
          SelectionVector::SelectionVector((SelectionVector *)&rvdata_1,uVar36);
          for (iVar19 = 0; uVar36 != iVar19; iVar19 = iVar19 + 1) {
            *(int *)((long)&(rvdata_1.sel)->sel_vector + iVar19 * 4) = (int)iVar19;
          }
          SelectionVector::SelectionVector((SelectionVector *)&child_validity,uVar36);
          SelectionVector::SelectionVector(&lcursor,uVar36);
          lchild.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          lchild.vector_type = FLAT_VECTOR;
          lchild._1_7_ = 0;
          lchild.type.id_ = INVALID;
          lchild.type.physical_type_ = ~INVALID;
          lchild.type._2_6_ = 0;
          lchild.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if (rcursor.sel_vector == (sel_t *)0x0) {
            null_mask_00.ptr = (ValidityMask *)0x0;
          }
          else {
            pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator->
                                ((optional_ptr<duckdb::ValidityMask,_true> *)&rcursor);
            iVar19 = ValidityMask::Capacity(pVVar13);
            null_mask_00.ptr = (ValidityMask *)&lchild;
            TemplatedValidityMask<unsigned_long>::Reset
                      ((TemplatedValidityMask<unsigned_long> *)null_mask_00.ptr,iVar19);
          }
          local_4d0 = 0;
          iVar19 = uVar36;
          for (__n = 0; __n < (ulong)((long)(this_00->
                                            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                            ).
                                            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(this_00->
                                            super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                            ).
                                            super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3);
              __n = __n + 1) {
            pvVar17 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::get<true>(this_00,__n);
            pVVar18 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar17);
            Vector::Vector((Vector *)&lvdata,pVVar18);
            Vector::Flatten((Vector *)&lvdata,uVar36);
            Vector::Slice((Vector *)&lvdata,(SelectionVector *)&rvdata_1,iVar19);
            pvVar17 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      ::get<true>(this_01,__n);
            pVVar18 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar17);
            Vector::Vector((Vector *)&rvdata,pVVar18);
            Vector::Flatten((Vector *)&rvdata,uVar36);
            Vector::Slice((Vector *)&rvdata,(SelectionVector *)&rvdata_1,iVar19);
            iVar29 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                               ((Vector *)&lvdata,(Vector *)&rvdata,(SelectionVector *)&rvdata_1,
                                iVar19,(SelectionVector *)&child_validity,&lcursor,null_mask_00);
            ExtractNestedMask((SelectionVector *)&rvdata_1,iVar19,&maybe_vec,null_mask_00.ptr,
                              (optional_ptr<duckdb::ValidityMask,_true>)rcursor.sel_vector);
            if (iVar29 != 0) {
              iVar19 = iVar19 - iVar29;
              oVar31.ptr = (SelectionVector *)&child_validity;
              if (iVar19 == 0) {
                oVar31.ptr = (SelectionVector *)&rvdata_1;
              }
              ExtractNestedSelection(oVar31.ptr,iVar29,&maybe_vec,&true_opt);
              DensifyNestedSelection(&lcursor,iVar19,(SelectionVector *)&rvdata_1);
              local_4d0 = local_4d0 + iVar29;
            }
            if (__n == ((long)(this_00->
                              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this_00->
                              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ).
                              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
              iVar29 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                                 ((Vector *)&lvdata,(Vector *)&rvdata,(SelectionVector *)&rvdata_1,
                                  iVar19,(SelectionVector *)&child_validity,&lcursor,null_mask_00);
              ExtractNestedMask((SelectionVector *)&rvdata_1,iVar19,&maybe_vec,null_mask_00.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)rcursor.sel_vector);
              oVar31.ptr = (SelectionVector *)&child_validity;
              if (iVar19 == iVar29) {
                oVar31.ptr = (SelectionVector *)&rvdata_1;
              }
              ExtractNestedSelection(oVar31.ptr,iVar29,&maybe_vec,&true_opt);
              oVar31.ptr = &lcursor;
              if (iVar29 == 0) {
                oVar31.ptr = (SelectionVector *)&rvdata_1;
              }
              ExtractNestedSelection(oVar31.ptr,iVar19 - iVar29,&maybe_vec,&false_opt);
              local_4d0 = local_4d0 + iVar29;
            }
            else {
              ExtractNestedMask((SelectionVector *)&rvdata_1,iVar19,&maybe_vec,null_mask_00.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)rcursor.sel_vector);
              oVar31.ptr = &lcursor;
              if (iVar19 == 0) {
                oVar31.ptr = (SelectionVector *)&rvdata_1;
              }
              ExtractNestedSelection(oVar31.ptr,0,&maybe_vec,&false_opt);
            }
            Vector::~Vector((Vector *)&rvdata);
            Vector::~Vector((Vector *)&lvdata);
          }
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&lchild.type.type_info_);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&lcursor.selection_data.internal.
                      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&child_validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                      internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&rvdata_1.validity);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&lvdata_1);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&rchild);
          goto LAB_017765e0;
        }
      }
      else {
        if (PVar1 != ARRAY) {
          this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&lvdata,"Unimplemented type for DISTINCT",(allocator *)&rvdata);
          NotImplementedException::NotImplementedException(this_03,(string *)&lvdata);
          __cxa_throw(this_03,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_3b8 = (optional_ptr<duckdb::ValidityMask,_true>)
                    (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
        if (uVar36 != 0) {
          iVar19 = ArrayType::GetSize(&l_not_null.type);
          SelectionVector::SelectionVector(&lcursor,uVar36);
          SelectionVector::SelectionVector(&rcursor,uVar36);
          pVVar15 = ArrayVector::GetEntry(&l_not_null);
          Vector::Vector((Vector *)&lvdata,pVVar15);
          pVVar15 = ArrayVector::GetEntry(&r_not_null);
          Vector::Vector((Vector *)&rvdata,pVVar15);
          iVar29 = ArrayVector::GetTotalSize(&l_not_null);
          Vector::Flatten((Vector *)&lvdata,iVar29);
          iVar29 = ArrayVector::GetTotalSize(&r_not_null);
          Vector::Flatten((Vector *)&rvdata,iVar29);
          Vector::Vector(&lchild,(Vector *)&lvdata,&lcursor,uVar36);
          Vector::Vector(&rchild,(Vector *)&rvdata,&rcursor,uVar36);
          UnifiedVectorFormat::UnifiedVectorFormat(&lvdata_1);
          Vector::ToUnifiedFormat(&l_not_null,uVar36,&lvdata_1);
          UnifiedVectorFormat::UnifiedVectorFormat(&rvdata_1);
          Vector::ToUnifiedFormat(&r_not_null,uVar36,&rvdata_1);
          SelectionVector::SelectionVector(&slice_sel,uVar36);
          for (iVar29 = 0; uVar36 != iVar29; iVar29 = iVar29 + 1) {
            slice_sel.sel_vector[iVar29] = (sel_t)iVar29;
          }
          SelectionVector::SelectionVector(&true_sel_1,uVar36);
          SelectionVector::SelectionVector(&false_sel_1,uVar36);
          child_validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          child_validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          child_validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          child_validity.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
          if (local_3b8.ptr == (ValidityMask *)0x0) {
            pos_1 = 0;
          }
          else {
            pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator->(&local_3b8);
            iVar29 = ValidityMask::Capacity(pVVar13);
            pos_1 = (idx_t)&child_validity;
            TemplatedValidityMask<unsigned_long>::Reset
                      ((TemplatedValidityMask<unsigned_long> *)pos_1,iVar29);
          }
          local_4d0 = 0;
          iVar29 = 0;
          while (uVar36 != 0) {
            PositionArrayCursor(&lcursor,&lvdata_1,iVar29,&slice_sel,uVar36,iVar19);
            PositionArrayCursor(&rcursor,&rvdata_1,iVar29,&slice_sel,uVar36,iVar19);
            iVar35 = 0;
            uVar22 = 0;
            for (uVar30 = 0; uVar36 != uVar30; uVar30 = uVar30 + 1) {
              uVar20 = uVar30;
              if (slice_sel.sel_vector != (sel_t *)0x0) {
                uVar20 = (ulong)slice_sel.sel_vector[uVar30];
              }
              if (iVar19 == iVar29) {
                if (maybe_vec.sel_vector != (sel_t *)0x0) {
                  uVar20 = (ulong)maybe_vec.sel_vector[uVar20];
                }
                if (false_opt.sel != (SelectionVector *)0x0) {
                  (false_opt.sel)->sel_vector[iVar35] = (sel_t)uVar20;
                }
                iVar35 = iVar35 + 1;
              }
              else {
                true_sel_1.sel_vector[uVar22] = (sel_t)uVar20;
                uVar22 = uVar22 + 1;
              }
            }
            OptionalSelection::Advance(&true_opt,0);
            OptionalSelection::Advance(&false_opt,iVar35);
            if (uVar22 < uVar36) {
              DensifyNestedSelection(&true_sel_1,uVar22,&slice_sel);
              PositionArrayCursor(&lcursor,&lvdata_1,iVar29,&slice_sel,uVar22,iVar19);
              PositionArrayCursor(&rcursor,&rvdata_1,iVar29,&slice_sel,uVar22,iVar19);
              uVar36 = uVar22;
            }
            iVar35 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                               (&lchild,&rchild,&slice_sel,uVar36,&true_sel_1,&false_sel_1,
                                (optional_ptr<duckdb::ValidityMask,_true>)pos_1);
            ExtractNestedMask(&slice_sel,uVar36,&maybe_vec,(ValidityMask *)pos_1,local_3b8);
            if (iVar35 != 0) {
              uVar36 = uVar36 - iVar35;
              oVar31.ptr = &true_sel_1;
              if (uVar36 == 0) {
                oVar31.ptr = &slice_sel;
              }
              ExtractNestedSelection(oVar31.ptr,iVar35,&maybe_vec,&true_opt);
              local_4d0 = local_4d0 + iVar35;
              DensifyNestedSelection(&false_sel_1,uVar36,&slice_sel);
              PositionArrayCursor(&lcursor,&lvdata_1,iVar29,&slice_sel,uVar36,iVar19);
              PositionArrayCursor(&rcursor,&rvdata_1,iVar29,&slice_sel,uVar36,iVar19);
            }
            ExtractNestedMask(&slice_sel,uVar36,&maybe_vec,(ValidityMask *)pos_1,local_3b8);
            oVar31.ptr = &false_sel_1;
            if (uVar36 == 0) {
              oVar31.ptr = &slice_sel;
            }
            ExtractNestedSelection(oVar31.ptr,0,&maybe_vec,&false_opt);
            iVar29 = iVar29 + 1;
          }
          goto LAB_0177653f;
        }
      }
LAB_01772eb3:
      local_4d0 = 0;
    }
LAB_017765e0:
    local_4d0 = local_4d0 + local_428;
    if (true_sel.ptr != (SelectionVector *)0x0) {
      pSVar12 = optional_ptr<duckdb::SelectionVector,_true>::operator*(&local_1a0);
      DensifyNestedSelection(&true_vec,local_4d0,pSVar12);
    }
    if (local_248.ptr != (SelectionVector *)0x0) {
      pSVar12 = optional_ptr<duckdb::SelectionVector,_true>::operator*(&local_248);
      DensifyNestedSelection(&false_vec,count - local_4d0,pSVar12);
    }
    Vector::~Vector(&r_not_null);
    Vector::~Vector(&l_not_null);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&maybe_vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&false_opt.vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&false_vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&true_opt.vec.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pUVar11 = (UnifiedVectorFormat *)&true_vec;
LAB_0177d83c:
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pUVar11->validity);
    return local_4d0;
  default:
    if (PVar1 == VARCHAR) {
      lchild._0_8_ = null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(left,sel.ptr,count,pVVar13);
        pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(right,sel.ptr,count,pVVar13);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          psVar26 = (string_t *)left->data;
          psVar43 = (string_t *)right->data;
          FlatVector::VerifyFlatVector(left);
          pVVar13 = &left->validity;
          FlatVector::VerifyFlatVector(right);
          pVVar34 = &right->validity;
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            lVar32 = 0;
            local_4d0 = 0;
            for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar45 = DistinctFrom::Operation<duckdb::string_t>(psVar26,psVar43,!bVar45,!bVar46);
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
              local_4d0 = local_4d0 + bVar45;
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)!bVar45;
              psVar43 = psVar43 + 1;
              psVar26 = psVar26 + 1;
            }
            return local_4d0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            local_4d0 = 0;
            for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar45 = DistinctFrom::Operation<duckdb::string_t>(psVar26,psVar43,!bVar45,!bVar46);
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
              local_4d0 = local_4d0 + bVar45;
              psVar43 = psVar43 + 1;
              psVar26 = psVar26 + 1;
            }
            return local_4d0;
          }
          lVar32 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar45 = DistinctFrom::Operation<duckdb::string_t>(psVar26,psVar43,!bVar45,!bVar46);
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)!bVar45;
            psVar43 = psVar43 + 1;
            psVar26 = psVar26 + 1;
          }
          goto LAB_0177cb26;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          psVar26 = (string_t *)left->data;
          psVar43 = (string_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(left);
          pVVar13 = &left->validity;
          iVar19 = 0;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar32 = 0;
              for (; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar46 = false;
                }
                else {
                  bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar45 = DistinctFrom::Operation<duckdb::string_t>(psVar26,psVar43,!bVar45,bVar46);
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
                lVar32 = lVar32 + (ulong)!bVar45;
                psVar26 = psVar26 + 1;
              }
              goto LAB_0177d82a;
            }
            local_4d0 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar46 = false;
              }
              else {
                bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = DistinctFrom::Operation<duckdb::string_t>(psVar26,psVar43,!bVar45,bVar46);
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
              local_4d0 = local_4d0 + bVar45;
              psVar26 = psVar26 + 1;
            }
          }
          else {
            lVar32 = 0;
            local_4d0 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar46 = false;
              }
              else {
                bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = DistinctFrom::Operation<duckdb::string_t>(psVar26,psVar43,!bVar45,bVar46);
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
              local_4d0 = local_4d0 + bVar45;
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)!bVar45;
              psVar26 = psVar26 + 1;
            }
          }
          goto LAB_0177d837;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          psVar26 = (string_t *)left->data;
          psVar43 = (string_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(right);
          pVVar13 = &right->validity;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            iVar19 = 0;
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar32 = 0;
              for (; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar45 = false;
                }
                else {
                  bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
                bVar45 = DistinctFrom::Operation<duckdb::string_t>(psVar26,psVar43,bVar45,!bVar46);
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
                lVar32 = lVar32 + (ulong)!bVar45;
                psVar43 = psVar43 + 1;
              }
              goto LAB_0177d82a;
            }
            local_4d0 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar45 = DistinctFrom::Operation<duckdb::string_t>(psVar26,psVar43,bVar45,!bVar46);
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
              local_4d0 = local_4d0 + bVar45;
              psVar43 = psVar43 + 1;
            }
          }
          else {
            lVar32 = 0;
            local_4d0 = 0;
            for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar45 = DistinctFrom::Operation<duckdb::string_t>(psVar26,psVar43,bVar45,!bVar46);
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
              local_4d0 = local_4d0 + bVar45;
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)!bVar45;
              psVar43 = psVar43 + 1;
            }
          }
          goto LAB_0177d837;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (*puVar3 & 1) == 0;
          }
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar46 = false;
          }
          else {
            bVar46 = (*puVar3 & 1) == 0;
          }
          bVar45 = DistinctFrom::Operation<duckdb::string_t>
                             ((string_t *)left->data,(string_t *)right->data,bVar45,bVar46);
          if (!bVar45) {
            if (false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              (false_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
            }
            return 0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              (true_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
            }
            return count;
          }
          return count;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
      UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
      Vector::ToUnifiedFormat(left,count,&lvdata);
      Vector::ToUnifiedFormat(right,count,&rvdata);
      if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0 ||
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          iVar19 = 0;
          for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
            iVar35 = iVar29;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
            }
            iVar16 = iVar29;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
            }
            iVar38 = iVar29;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) == 0;
            }
            bVar45 = DistinctFrom::Operation<duckdb::string_t>
                               ((string_t *)(lvdata.data + iVar16 * 0x10),
                                (string_t *)(rvdata.data + iVar38 * 0x10),bVar45,bVar46);
            if (bVar45) {
              iVar16 = local_4d0;
              oVar21.ptr = true_sel.ptr;
              iVar38 = iVar19;
              local_4d0 = local_4d0 + 1;
            }
            else {
              iVar38 = iVar19 + 1;
              iVar16 = iVar19;
              oVar21.ptr = false_sel.ptr;
            }
            (oVar21.ptr)->sel_vector[iVar16] = (sel_t)iVar35;
            iVar19 = iVar38;
          }
          goto LAB_0177bb35;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            iVar35 = iVar19;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
            }
            iVar16 = iVar19;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) == 0;
            }
            bVar45 = DistinctFrom::Operation<duckdb::string_t>
                               ((string_t *)(lvdata.data + iVar35 * 0x10),
                                (string_t *)(rvdata.data + iVar16 * 0x10),bVar45,bVar46);
            if (bVar45) {
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
              local_4d0 = local_4d0 + 1;
            }
          }
          goto LAB_0177bb35;
        }
        lVar32 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          iVar35 = iVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
          }
          iVar16 = iVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar46 = false;
          }
          else {
            bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) == 0;
          }
          bVar45 = DistinctFrom::Operation<duckdb::string_t>
                             ((string_t *)(lvdata.data + iVar35 * 0x10),
                              (string_t *)(rvdata.data + iVar16 * 0x10),bVar45,bVar46);
          if (!bVar45) {
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + 1;
          }
        }
        goto LAB_0177b9ec;
      }
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        iVar19 = 0;
        for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
          iVar35 = iVar29;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
          }
          iVar16 = iVar29;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
          }
          iVar38 = iVar29;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
          }
          bVar45 = NotEquals::Operation<duckdb::string_t>
                             ((string_t *)(lvdata.data + iVar16 * 0x10),
                              (string_t *)(rvdata.data + iVar38 * 0x10));
          if (bVar45) {
            iVar16 = local_4d0;
            oVar21.ptr = true_sel.ptr;
            iVar38 = iVar19;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar38 = iVar19 + 1;
            iVar16 = iVar19;
            oVar21.ptr = false_sel.ptr;
          }
          (oVar21.ptr)->sel_vector[iVar16] = (sel_t)iVar35;
          iVar19 = iVar38;
        }
        goto LAB_0177bb35;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          iVar35 = iVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
          }
          iVar16 = iVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
          }
          bVar45 = NotEquals::Operation<duckdb::string_t>
                             ((string_t *)(lvdata.data + iVar35 * 0x10),
                              (string_t *)(rvdata.data + iVar16 * 0x10));
          if (bVar45) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + 1;
          }
        }
        goto LAB_0177bb35;
      }
      lVar32 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        bVar45 = NotEquals::Operation<duckdb::string_t>
                           ((string_t *)(lvdata.data + iVar35 * 0x10),
                            (string_t *)(rvdata.data + iVar16 * 0x10));
        if (!bVar45) {
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + 1;
        }
      }
    }
    else {
      if (PVar1 != UINT128) {
        if (PVar1 != INT128) goto switchD_01771e84_caseD_a;
        lchild._0_8_ = null_mask.ptr;
        if (sel.ptr == (SelectionVector *)0x0) {
          sel.ptr = FlatVector::IncrementalSelectionVector();
        }
        if (null_mask.ptr != (ValidityMask *)0x0) {
          pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                              ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
          UpdateNullMask(left,sel.ptr,count,pVVar13);
          pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                              ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
          UpdateNullMask(right,sel.ptr,count,pVVar13);
        }
        if (left->vector_type == FLAT_VECTOR) {
          if (right->vector_type == FLAT_VECTOR) {
            pdVar9 = left->data;
            pdVar10 = right->data;
            FlatVector::VerifyFlatVector(left);
            pVVar13 = &left->validity;
            FlatVector::VerifyFlatVector(right);
            pVVar34 = &right->validity;
            lVar32 = 8;
            if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
              lVar39 = 0;
              local_4d0 = 0;
              for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
                bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
                if (bVar45 && bVar46) {
                  bVar45 = *(long *)(pdVar9 + lVar32) != *(long *)(pdVar10 + lVar32) ||
                           *(long *)(pdVar9 + lVar32 + -8) != *(long *)(pdVar10 + lVar32 + -8);
                }
                else {
                  bVar45 = bVar45 != bVar46;
                }
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
                local_4d0 = local_4d0 + bVar45;
                (false_sel.ptr)->sel_vector[lVar39] = (sel_t)iVar29;
                lVar39 = lVar39 + (ulong)(bVar45 ^ 1);
                lVar32 = lVar32 + 0x10;
              }
              return local_4d0;
            }
            iVar19 = 0;
            if (true_sel.ptr != (SelectionVector *)0x0) {
              local_4d0 = 0;
              for (; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
                bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
                if (bVar45 && bVar46) {
                  bVar45 = *(long *)(pdVar9 + lVar32) != *(long *)(pdVar10 + lVar32) ||
                           *(long *)(pdVar9 + lVar32 + -8) != *(long *)(pdVar10 + lVar32 + -8);
                }
                else {
                  bVar45 = bVar45 != bVar46;
                }
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
                local_4d0 = local_4d0 + bVar45;
                lVar32 = lVar32 + 0x10;
              }
              return local_4d0;
            }
            lVar39 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (bVar45 && bVar46) {
                bVar45 = *(long *)(pdVar9 + lVar32) != *(long *)(pdVar10 + lVar32) ||
                         *(long *)(pdVar9 + lVar32 + -8) != *(long *)(pdVar10 + lVar32 + -8);
              }
              else {
                bVar45 = bVar45 != bVar46;
              }
              (false_sel.ptr)->sel_vector[lVar39] = (sel_t)iVar29;
              lVar39 = lVar39 + (ulong)(bVar45 ^ 1);
              lVar32 = lVar32 + 0x10;
            }
            return count - lVar39;
          }
          if (right->vector_type == CONSTANT_VECTOR) {
            pdVar9 = left->data;
            plVar8 = (long *)right->data;
            lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)0x0;
            lvdata.sel = (SelectionVector *)0x0;
            lvdata.data = (data_ptr_t)0x0;
            lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x800;
            puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
              TemplatedValidityMask<unsigned_long>::SetAllInvalid
                        ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
            }
            FlatVector::VerifyFlatVector(left);
            pVVar13 = &left->validity;
            plVar37 = (long *)(pdVar9 + 8);
            iVar19 = 0;
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                lVar32 = 0;
                for (; count != iVar19; iVar19 = iVar19 + 1) {
                  iVar29 = iVar19;
                  if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                    iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                  }
                  bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                     (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
                  if (lvdata.sel == (SelectionVector *)0x0) {
                    bVar46 = false;
                  }
                  else {
                    bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                  }
                  if ((bVar46 | !bVar45) == 1) {
                    bVar46 = (bool)(bVar46 ^ !bVar45);
                  }
                  else {
                    bVar46 = *plVar37 != plVar8[1] || plVar37[-1] != *plVar8;
                  }
                  (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
                  lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
                  plVar37 = plVar37 + 2;
                }
LAB_0177d82a:
                local_4d0 = count - lVar32;
              }
              else {
                local_4d0 = 0;
                for (; count != iVar19; iVar19 = iVar19 + 1) {
                  iVar29 = iVar19;
                  if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                    iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                  }
                  bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                     (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
                  if (lvdata.sel == (SelectionVector *)0x0) {
                    bVar46 = false;
                  }
                  else {
                    bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                  }
                  if ((bVar46 | !bVar45) == 1) {
                    bVar46 = (bool)(bVar46 ^ !bVar45);
                  }
                  else {
                    bVar46 = *plVar37 != plVar8[1] || plVar37[-1] != *plVar8;
                  }
                  (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
                  local_4d0 = local_4d0 + bVar46;
                  plVar37 = plVar37 + 2;
                }
              }
            }
            else {
              lVar32 = 0;
              local_4d0 = 0;
              for (; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar46 = false;
                }
                else {
                  bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                if ((bVar46 | !bVar45) == 1) {
                  bVar46 = (bool)(bVar46 ^ !bVar45);
                }
                else {
                  bVar46 = *plVar37 != plVar8[1] || plVar37[-1] != *plVar8;
                }
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
                local_4d0 = local_4d0 + bVar46;
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
                lVar32 = lVar32 + (ulong)(bVar46 ^ 1);
                plVar37 = plVar37 + 2;
              }
            }
LAB_0177d837:
            pUVar11 = &lvdata;
            goto LAB_0177d83c;
          }
        }
        else if (left->vector_type == CONSTANT_VECTOR) {
          if (right->vector_type == FLAT_VECTOR) {
            plVar8 = (long *)left->data;
            pdVar9 = right->data;
            lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)0x0;
            lvdata.sel = (SelectionVector *)0x0;
            lvdata.data = (data_ptr_t)0x0;
            lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x800;
            puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
              TemplatedValidityMask<unsigned_long>::SetAllInvalid
                        ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
            }
            FlatVector::VerifyFlatVector(right);
            pVVar13 = &right->validity;
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              plVar37 = (long *)(pdVar9 + 8);
              iVar19 = 0;
              if (true_sel.ptr == (SelectionVector *)0x0) {
                lVar32 = 0;
                for (; count != iVar19; iVar19 = iVar19 + 1) {
                  iVar29 = iVar19;
                  if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                    iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                  }
                  if (lvdata.sel == (SelectionVector *)0x0) {
                    bVar45 = false;
                  }
                  else {
                    bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                  }
                  bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                     (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
                  if ((bVar45 | !bVar46) == 1) {
                    bVar45 = (bool)(bVar45 ^ !bVar46);
                  }
                  else {
                    bVar45 = plVar8[1] != *plVar37 || *plVar8 != plVar37[-1];
                  }
                  (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
                  lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
                  plVar37 = plVar37 + 2;
                }
                goto LAB_0177d82a;
              }
              local_4d0 = 0;
              for (; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar45 = false;
                }
                else {
                  bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
                if ((bVar45 | !bVar46) == 1) {
                  bVar45 = (bool)(bVar45 ^ !bVar46);
                }
                else {
                  bVar45 = plVar8[1] != *plVar37 || *plVar8 != plVar37[-1];
                }
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
                local_4d0 = local_4d0 + bVar45;
                plVar37 = plVar37 + 2;
              }
            }
            else {
              plVar37 = (long *)(pdVar9 + 8);
              lVar32 = 0;
              local_4d0 = 0;
              for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar45 = false;
                }
                else {
                  bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
                if ((bVar45 | !bVar46) == 1) {
                  bVar45 = (bool)(bVar45 ^ !bVar46);
                }
                else {
                  bVar45 = plVar8[1] != *plVar37 || *plVar8 != plVar37[-1];
                }
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
                local_4d0 = local_4d0 + bVar45;
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
                lVar32 = lVar32 + (ulong)(bVar45 ^ 1);
                plVar37 = plVar37 + 2;
              }
            }
            goto LAB_0177d837;
          }
          if (right->vector_type == CONSTANT_VECTOR) {
            puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = (*puVar3 & 1) == 0;
            }
            puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar3 == (unsigned_long *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = (*puVar3 & 1) == 0;
            }
            if ((bVar45 | bVar46) == 1) {
              if (bVar45 != bVar46) {
LAB_0177c439:
                if (true_sel.ptr != (SelectionVector *)0x0) {
                  for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
                    iVar29 = iVar19;
                    if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                      iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                    }
                    (true_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
                  }
                  return count;
                }
                return count;
              }
            }
            else if ((*(long *)left->data != *(long *)right->data) ||
                    (*(long *)((long)left->data + 8) != *(long *)((long)right->data + 8)))
            goto LAB_0177c439;
            if (false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              (false_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
            }
            return 0;
          }
        }
        UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
        UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
        Vector::ToUnifiedFormat(left,count,&lvdata);
        Vector::ToUnifiedFormat(right,count,&rvdata);
        if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0 ||
            rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            iVar19 = 0;
            local_4d0 = 0;
            for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
              iVar35 = iVar29;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
              }
              iVar16 = iVar29;
              if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
              }
              iVar38 = iVar29;
              if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
                iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
              }
              bVar45 = true;
              bVar46 = true;
              if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                  (unsigned_long *)0x0) {
                bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                          [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
              }
              if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                  (unsigned_long *)0x0) {
                bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                          [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) != 0;
              }
              if ((bVar46 & bVar45) == 0) {
                if (bVar46 == bVar45) goto LAB_01775c54;
LAB_01775c66:
                iVar16 = local_4d0;
                oVar21.ptr = true_sel.ptr;
                local_4d0 = local_4d0 + 1;
              }
              else {
                if ((*(long *)(lvdata.data + iVar16 * 0x10) !=
                     *(long *)(rvdata.data + iVar38 * 0x10)) ||
                   (*(long *)(lvdata.data + iVar16 * 0x10 + 8) !=
                    *(long *)(rvdata.data + iVar38 * 0x10 + 8))) goto LAB_01775c66;
LAB_01775c54:
                iVar16 = iVar19;
                iVar19 = iVar19 + 1;
                oVar21.ptr = false_sel.ptr;
              }
              (oVar21.ptr)->sel_vector[iVar16] = (sel_t)iVar35;
            }
            goto LAB_0177bb35;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            local_4d0 = 0;
            for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              iVar35 = iVar19;
              if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
                iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
              }
              iVar16 = iVar19;
              if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
                iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
              }
              bVar45 = true;
              bVar46 = true;
              if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                  (unsigned_long *)0x0) {
                bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                          [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
              }
              if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                  (unsigned_long *)0x0) {
                bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                          [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
              }
              if ((bVar46 & bVar45) == 0) {
                if (bVar46 != bVar45) goto LAB_01777970;
              }
              else if ((*(long *)(lvdata.data + iVar35 * 0x10) !=
                        *(long *)(rvdata.data + iVar16 * 0x10)) ||
                      (*(long *)(lvdata.data + iVar35 * 0x10 + 8) !=
                       *(long *)(rvdata.data + iVar16 * 0x10 + 8))) {
LAB_01777970:
                (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
                local_4d0 = local_4d0 + 1;
              }
            }
            goto LAB_0177bb35;
          }
          lVar32 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            iVar35 = iVar19;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
            }
            iVar16 = iVar19;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
            }
            bVar45 = true;
            bVar46 = true;
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) {
              bVar46 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) != 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                (unsigned_long *)0x0) {
              bVar45 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) != 0;
            }
            if ((bVar46 & bVar45) == 0) {
              if (bVar46 == bVar45) goto LAB_0177bb11;
            }
            else if ((*(long *)(lvdata.data + iVar35 * 0x10) ==
                      *(long *)(rvdata.data + iVar16 * 0x10)) &&
                    (*(long *)(lvdata.data + iVar35 * 0x10 + 8) ==
                     *(long *)(rvdata.data + iVar16 * 0x10 + 8))) {
LAB_0177bb11:
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + 1;
            }
          }
          goto LAB_0177bb28;
        }
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          iVar19 = 0;
          for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
            iVar35 = iVar29;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
            }
            iVar16 = iVar29;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
            }
            iVar38 = iVar29;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
            }
            if ((*(long *)(lvdata.data + iVar16 * 0x10) == *(long *)(rvdata.data + iVar38 * 0x10))
               && (*(long *)(lvdata.data + iVar16 * 0x10 + 8) ==
                   *(long *)(rvdata.data + iVar38 * 0x10 + 8))) {
              iVar16 = iVar19 + 1;
              oVar21.ptr = false_sel.ptr;
            }
            else {
              iVar16 = iVar19;
              iVar19 = local_4d0;
              oVar21.ptr = true_sel.ptr;
              local_4d0 = local_4d0 + 1;
            }
            (oVar21.ptr)->sel_vector[iVar19] = (sel_t)iVar35;
            iVar19 = iVar16;
          }
          goto LAB_0177bb35;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            iVar35 = iVar19;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
            }
            iVar16 = iVar19;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
            }
            if ((*(long *)(lvdata.data + iVar35 * 0x10) != *(long *)(rvdata.data + iVar16 * 0x10))
               || (*(long *)(lvdata.data + iVar35 * 0x10 + 8) !=
                   *(long *)(rvdata.data + iVar16 * 0x10 + 8))) {
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
              local_4d0 = local_4d0 + 1;
            }
          }
          goto LAB_0177bb35;
        }
        lVar32 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          iVar35 = iVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
          }
          iVar16 = iVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
          }
          if ((*(long *)(lvdata.data + iVar35 * 0x10) == *(long *)(rvdata.data + iVar16 * 0x10)) &&
             (*(long *)(lvdata.data + iVar35 * 0x10 + 8) ==
              *(long *)(rvdata.data + iVar16 * 0x10 + 8))) {
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + 1;
          }
        }
        break;
      }
      lchild._0_8_ = null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (null_mask.ptr != (ValidityMask *)0x0) {
        pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(left,sel.ptr,count,pVVar13);
        pVVar13 = optional_ptr<duckdb::ValidityMask,_true>::operator*
                            ((optional_ptr<duckdb::ValidityMask,_true> *)&lchild);
        UpdateNullMask(right,sel.ptr,count,pVVar13);
      }
      if (left->vector_type == FLAT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          puVar27 = (uhugeint_t *)left->data;
          puVar44 = (uhugeint_t *)right->data;
          FlatVector::VerifyFlatVector(left);
          pVVar13 = &left->validity;
          FlatVector::VerifyFlatVector(right);
          pVVar34 = &right->validity;
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            lVar32 = 0;
            local_4d0 = 0;
            for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar45 = DistinctFrom::Operation<duckdb::uhugeint_t>(puVar27,puVar44,!bVar45,!bVar46);
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
              local_4d0 = local_4d0 + bVar45;
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)!bVar45;
              puVar44 = puVar44 + 1;
              puVar27 = puVar27 + 1;
            }
            return local_4d0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            local_4d0 = 0;
            for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar45 = DistinctFrom::Operation<duckdb::uhugeint_t>(puVar27,puVar44,!bVar45,!bVar46);
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
              local_4d0 = local_4d0 + bVar45;
              puVar44 = puVar44 + 1;
              puVar27 = puVar27 + 1;
            }
            return local_4d0;
          }
          lVar32 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                               (&pVVar34->super_TemplatedValidityMask<unsigned_long>,iVar19);
            bVar45 = DistinctFrom::Operation<duckdb::uhugeint_t>(puVar27,puVar44,!bVar45,!bVar46);
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + (ulong)!bVar45;
            puVar44 = puVar44 + 1;
            puVar27 = puVar27 + 1;
          }
          goto LAB_0177cb26;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar27 = (uhugeint_t *)left->data;
          puVar44 = (uhugeint_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(left);
          pVVar13 = &left->validity;
          iVar19 = 0;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar32 = 0;
              for (; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar46 = false;
                }
                else {
                  bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar45 = DistinctFrom::Operation<duckdb::uhugeint_t>(puVar27,puVar44,!bVar45,bVar46)
                ;
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
                lVar32 = lVar32 + (ulong)!bVar45;
                puVar27 = puVar27 + 1;
              }
              goto LAB_0177d82a;
            }
            local_4d0 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar46 = false;
              }
              else {
                bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = DistinctFrom::Operation<duckdb::uhugeint_t>(puVar27,puVar44,!bVar45,bVar46);
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
              local_4d0 = local_4d0 + bVar45;
              puVar27 = puVar27 + 1;
            }
          }
          else {
            lVar32 = 0;
            local_4d0 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              bVar45 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar46 = false;
              }
              else {
                bVar46 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar45 = DistinctFrom::Operation<duckdb::uhugeint_t>(puVar27,puVar44,!bVar45,bVar46);
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
              local_4d0 = local_4d0 + bVar45;
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)!bVar45;
              puVar27 = puVar27 + 1;
            }
          }
          goto LAB_0177d837;
        }
      }
      else if (left->vector_type == CONSTANT_VECTOR) {
        if (right->vector_type == FLAT_VECTOR) {
          puVar27 = (uhugeint_t *)left->data;
          puVar44 = (uhugeint_t *)right->data;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          lvdata.sel = (SelectionVector *)0x0;
          lvdata.data = (data_ptr_t)0x0;
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x800;
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
            TemplatedValidityMask<unsigned_long>::SetAllInvalid
                      ((TemplatedValidityMask<unsigned_long> *)&lvdata,1);
          }
          FlatVector::VerifyFlatVector(right);
          pVVar13 = &right->validity;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            iVar19 = 0;
            if (true_sel.ptr == (SelectionVector *)0x0) {
              lVar32 = 0;
              for (; count != iVar19; iVar19 = iVar19 + 1) {
                iVar29 = iVar19;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
                }
                if (lvdata.sel == (SelectionVector *)0x0) {
                  bVar45 = false;
                }
                else {
                  bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
                }
                bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                   (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
                bVar45 = DistinctFrom::Operation<duckdb::uhugeint_t>(puVar27,puVar44,bVar45,!bVar46)
                ;
                (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
                lVar32 = lVar32 + (ulong)!bVar45;
                puVar44 = puVar44 + 1;
              }
              goto LAB_0177d82a;
            }
            local_4d0 = 0;
            for (; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar45 = DistinctFrom::Operation<duckdb::uhugeint_t>(puVar27,puVar44,bVar45,!bVar46);
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
              local_4d0 = local_4d0 + bVar45;
              puVar44 = puVar44 + 1;
            }
          }
          else {
            lVar32 = 0;
            local_4d0 = 0;
            for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              if (lvdata.sel == (SelectionVector *)0x0) {
                bVar45 = false;
              }
              else {
                bVar45 = ((ulong)(lvdata.sel)->sel_vector & 1) == 0;
              }
              bVar46 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                 (&pVVar13->super_TemplatedValidityMask<unsigned_long>,iVar19);
              bVar45 = DistinctFrom::Operation<duckdb::uhugeint_t>(puVar27,puVar44,bVar45,!bVar46);
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
              local_4d0 = local_4d0 + bVar45;
              (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
              lVar32 = lVar32 + (ulong)!bVar45;
              puVar44 = puVar44 + 1;
            }
          }
          goto LAB_0177d837;
        }
        if (right->vector_type == CONSTANT_VECTOR) {
          puVar3 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (*puVar3 & 1) == 0;
          }
          puVar3 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            bVar46 = false;
          }
          else {
            bVar46 = (*puVar3 & 1) == 0;
          }
          bVar45 = DistinctFrom::Operation<duckdb::uhugeint_t>
                             ((uhugeint_t *)left->data,(uhugeint_t *)right->data,bVar45,bVar46);
          if (!bVar45) {
            if (false_sel.ptr == (SelectionVector *)0x0) {
              return 0;
            }
            for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              (false_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
            }
            return 0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
              iVar29 = iVar19;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
              }
              (true_sel.ptr)->sel_vector[iVar19] = (sel_t)iVar29;
            }
            return count;
          }
          return count;
        }
      }
      UnifiedVectorFormat::UnifiedVectorFormat(&lvdata);
      UnifiedVectorFormat::UnifiedVectorFormat(&rvdata);
      Vector::ToUnifiedFormat(left,count,&lvdata);
      Vector::ToUnifiedFormat(right,count,&rvdata);
      if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0 ||
          lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          iVar19 = 0;
          for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
            iVar35 = iVar29;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
            }
            iVar16 = iVar29;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
            }
            iVar38 = iVar29;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar38 >> 6] >> (iVar38 & 0x3f) & 1) == 0;
            }
            bVar45 = DistinctFrom::Operation<duckdb::uhugeint_t>
                               ((uhugeint_t *)(lvdata.data + iVar16 * 0x10),
                                (uhugeint_t *)(rvdata.data + iVar38 * 0x10),bVar45,bVar46);
            if (bVar45) {
              iVar16 = local_4d0;
              oVar21.ptr = true_sel.ptr;
              iVar38 = iVar19;
              local_4d0 = local_4d0 + 1;
            }
            else {
              iVar38 = iVar19 + 1;
              iVar16 = iVar19;
              oVar21.ptr = false_sel.ptr;
            }
            (oVar21.ptr)->sel_vector[iVar16] = (sel_t)iVar35;
            iVar19 = iVar38;
          }
          goto LAB_0177bb35;
        }
        if (true_sel.ptr != (SelectionVector *)0x0) {
          local_4d0 = 0;
          for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
            iVar29 = iVar19;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
            }
            iVar35 = iVar19;
            if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
            }
            iVar16 = iVar19;
            if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
              iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
            }
            if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar45 = false;
            }
            else {
              bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) == 0;
            }
            if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              bVar46 = false;
            }
            else {
              bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                        [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) == 0;
            }
            bVar45 = DistinctFrom::Operation<duckdb::uhugeint_t>
                               ((uhugeint_t *)(lvdata.data + iVar35 * 0x10),
                                (uhugeint_t *)(rvdata.data + iVar16 * 0x10),bVar45,bVar46);
            if (bVar45) {
              (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
              local_4d0 = local_4d0 + 1;
            }
          }
          goto LAB_0177bb35;
        }
        lVar32 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          iVar35 = iVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
          }
          iVar16 = iVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
          }
          if (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (lvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar35 >> 6] >> (iVar35 & 0x3f) & 1) == 0;
          }
          if (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar46 = false;
          }
          else {
            bVar46 = (rvdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [iVar16 >> 6] >> (iVar16 & 0x3f) & 1) == 0;
          }
          bVar45 = DistinctFrom::Operation<duckdb::uhugeint_t>
                             ((uhugeint_t *)(lvdata.data + iVar35 * 0x10),
                              (uhugeint_t *)(rvdata.data + iVar16 * 0x10),bVar45,bVar46);
          if (!bVar45) {
            (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
            lVar32 = lVar32 + 1;
          }
        }
        goto LAB_0177b9ec;
      }
      if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        iVar19 = 0;
        for (iVar29 = 0; count != iVar29; iVar29 = iVar29 + 1) {
          iVar35 = iVar29;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(sel.ptr)->sel_vector[iVar29];
          }
          iVar16 = iVar29;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(lvdata.sel)->sel_vector[iVar29];
          }
          iVar38 = iVar29;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar38 = (idx_t)(rvdata.sel)->sel_vector[iVar29];
          }
          bVar45 = NotEquals::Operation<duckdb::uhugeint_t>
                             ((uhugeint_t *)(lvdata.data + iVar16 * 0x10),
                              (uhugeint_t *)(rvdata.data + iVar38 * 0x10));
          if (bVar45) {
            iVar16 = local_4d0;
            oVar21.ptr = true_sel.ptr;
            iVar38 = iVar19;
            local_4d0 = local_4d0 + 1;
          }
          else {
            iVar38 = iVar19 + 1;
            iVar16 = iVar19;
            oVar21.ptr = false_sel.ptr;
          }
          (oVar21.ptr)->sel_vector[iVar16] = (sel_t)iVar35;
          iVar19 = iVar38;
        }
        goto LAB_0177bb35;
      }
      if (true_sel.ptr != (SelectionVector *)0x0) {
        local_4d0 = 0;
        for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
          iVar29 = iVar19;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
          }
          iVar35 = iVar19;
          if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
          }
          iVar16 = iVar19;
          if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
            iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
          }
          bVar45 = NotEquals::Operation<duckdb::uhugeint_t>
                             ((uhugeint_t *)(lvdata.data + iVar35 * 0x10),
                              (uhugeint_t *)(rvdata.data + iVar16 * 0x10));
          if (bVar45) {
            (true_sel.ptr)->sel_vector[local_4d0] = (sel_t)iVar29;
            local_4d0 = local_4d0 + 1;
          }
        }
        goto LAB_0177bb35;
      }
      lVar32 = 0;
      for (iVar19 = 0; count != iVar19; iVar19 = iVar19 + 1) {
        iVar29 = iVar19;
        if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
          iVar29 = (idx_t)(sel.ptr)->sel_vector[iVar19];
        }
        iVar35 = iVar19;
        if ((lvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar35 = (idx_t)(lvdata.sel)->sel_vector[iVar19];
        }
        iVar16 = iVar19;
        if ((rvdata.sel)->sel_vector != (sel_t *)0x0) {
          iVar16 = (idx_t)(rvdata.sel)->sel_vector[iVar19];
        }
        bVar45 = NotEquals::Operation<duckdb::uhugeint_t>
                           ((uhugeint_t *)(lvdata.data + iVar35 * 0x10),
                            (uhugeint_t *)(rvdata.data + iVar16 * 0x10));
        if (!bVar45) {
          (false_sel.ptr)->sel_vector[lVar32] = (sel_t)iVar29;
          lVar32 = lVar32 + 1;
        }
      }
    }
LAB_0177b921:
    local_4d0 = count - lVar32;
    goto LAB_0177bb35;
  }
  local_4d0 = count - lVar32;
LAB_0177bb35:
  UnifiedVectorFormat::~UnifiedVectorFormat(&rvdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&lvdata);
  return local_4d0;
}

Assistant:

static idx_t TemplatedDistinctSelectOperation(Vector &left, Vector &right, optional_ptr<const SelectionVector> sel,
                                              idx_t count, optional_ptr<SelectionVector> true_sel,
                                              optional_ptr<SelectionVector> false_sel,
                                              optional_ptr<ValidityMask> null_mask) {

	switch (left.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return DistinctSelect<int8_t, int8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INT16:
		return DistinctSelect<int16_t, int16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT32:
		return DistinctSelect<int32_t, int32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT64:
		return DistinctSelect<int64_t, int64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT8:
		return DistinctSelect<uint8_t, uint8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT16:
		return DistinctSelect<uint16_t, uint16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT32:
		return DistinctSelect<uint32_t, uint32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT64:
		return DistinctSelect<uint64_t, uint64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::INT128:
		return DistinctSelect<hugeint_t, hugeint_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                                null_mask);
	case PhysicalType::UINT128:
		return DistinctSelect<uhugeint_t, uhugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::FLOAT:
		return DistinctSelect<float, float, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                        null_mask);
	case PhysicalType::DOUBLE:
		return DistinctSelect<double, double, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INTERVAL:
		return DistinctSelect<interval_t, interval_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::VARCHAR:
		return DistinctSelect<string_t, string_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return DistinctSelectNested<OP>(left, right, sel, count, true_sel, false_sel, null_mask);
	default:
		throw InternalException("Invalid type for distinct selection");
	}
}